

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::sse2::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Scene **ppSVar5;
  Scene **ppSVar6;
  Scene **ppSVar7;
  Scene **ppSVar8;
  Primitive *pPVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Primitive PVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined6 uVar40;
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  undefined1 auVar60 [12];
  undefined1 auVar61 [12];
  int iVar62;
  undefined4 uVar63;
  ulong uVar64;
  long lVar65;
  undefined4 uVar69;
  long extraout_RAX;
  long extraout_RAX_00;
  long extraout_RAX_01;
  long extraout_RAX_02;
  RayK<4> *pRVar66;
  long extraout_RAX_03;
  long extraout_RAX_04;
  long extraout_RAX_05;
  long extraout_RAX_06;
  RTCFilterFunctionN p_Var67;
  ulong uVar68;
  RTCIntersectArguments *pRVar70;
  ulong uVar71;
  long lVar72;
  byte bVar73;
  ulong uVar74;
  int iVar75;
  long lVar76;
  RTCFilterFunctionNArguments *pRVar77;
  byte bVar78;
  long lVar79;
  uint uVar80;
  uint uVar81;
  uint uVar82;
  uint uVar83;
  uint uVar84;
  short sVar85;
  undefined2 uVar127;
  float fVar86;
  uint uVar87;
  float fVar128;
  float fVar130;
  __m128 a_1;
  uint uVar129;
  uint uVar131;
  uint uVar132;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  undefined1 auVar101 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 extraout_var [12];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar133;
  float fVar160;
  float fVar161;
  vfloat4 a;
  undefined1 auVar134 [16];
  undefined1 auVar137 [16];
  undefined1 auVar140 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar162;
  float fVar174;
  float fVar175;
  vfloat4 v;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar176;
  float fVar195;
  float fVar196;
  vfloat4 v_1;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar197;
  float fVar208;
  float fVar209;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar210;
  float fVar233;
  float fVar234;
  undefined1 auVar211 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [16];
  undefined1 auVar220 [16];
  undefined1 auVar223 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar235;
  float fVar242;
  float fVar243;
  undefined1 auVar236 [16];
  undefined4 uVar244;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar245;
  float fVar258;
  float fVar259;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar260;
  float fVar265;
  float fVar266;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar267;
  float fVar274;
  float fVar277;
  undefined1 auVar268 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar275;
  float fVar276;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar273 [16];
  float fVar282;
  float fVar283;
  float fVar293;
  float fVar295;
  undefined1 auVar284 [16];
  undefined1 auVar287 [16];
  float fVar294;
  float fVar296;
  float fVar297;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  float fVar298;
  float fVar306;
  float fVar308;
  float fVar310;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar303 [16];
  float fVar307;
  float fVar309;
  float fVar311;
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar321;
  float fVar324;
  float fVar327;
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar319 [16];
  float fVar322;
  float fVar323;
  float fVar325;
  float fVar326;
  float fVar328;
  float fVar329;
  undefined1 auVar320 [16];
  float fVar330;
  float fVar331;
  float fVar339;
  float fVar340;
  float fVar341;
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar336 [16];
  undefined1 auVar338 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  float fVar345;
  float fVar351;
  float fVar352;
  float fVar353;
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx u_outer1;
  vfloatx u_outer0;
  vboolx valid;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  bool local_6a9;
  undefined1 local_608 [8];
  float fStack_600;
  float fStack_5fc;
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float fStack_5cc;
  undefined8 local_578;
  undefined8 uStack_570;
  RTCFilterFunctionNArguments *local_560;
  undefined1 local_558 [8];
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  undefined1 local_518 [4];
  float fStack_514;
  undefined8 uStack_510;
  RTCRayQueryContext *local_508;
  RayK<4> *local_500;
  RTCHitN *local_4f8;
  uint local_4f0;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  undefined8 *local_438;
  ulong local_430;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [16];
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  float local_398 [4];
  float local_388 [4];
  Primitive *local_378;
  ulong local_370;
  uint local_368;
  uint uStack_364;
  uint uStack_360;
  uint uStack_35c;
  uint local_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  uint local_348;
  uint uStack_344;
  uint uStack_340;
  uint uStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint local_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  uint local_f8 [4];
  float afStack_e8 [6];
  float local_d0 [40];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 uVar126;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar171 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar190 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar335 [16];
  undefined1 auVar337 [16];
  
  PVar18 = prim[1];
  uVar64 = (ulong)(byte)PVar18;
  lVar65 = uVar64 * 0x25;
  pPVar9 = prim + lVar65 + 6;
  fVar175 = *(float *)(pPVar9 + 0xc);
  fVar176 = (*(float *)(ray + k * 4) - *(float *)pPVar9) * fVar175;
  fVar195 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar9 + 4)) * fVar175;
  fVar196 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar9 + 8)) * fVar175;
  fVar162 = *(float *)(ray + k * 4 + 0x40) * fVar175;
  fVar174 = *(float *)(ray + k * 4 + 0x50) * fVar175;
  fVar175 = *(float *)(ray + k * 4 + 0x60) * fVar175;
  uVar63 = *(undefined4 *)(prim + uVar64 * 4 + 6);
  uVar126 = (undefined1)((uint)uVar63 >> 0x18);
  uVar127 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar63 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar127,uVar126),CONCAT14(uVar126,uVar63));
  uVar126 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar126),uVar126);
  sVar85 = CONCAT11((char)uVar63,(char)uVar63);
  uVar74 = CONCAT62(uVar40,sVar85);
  auVar272._8_4_ = 0;
  auVar272._0_8_ = uVar74;
  auVar272._12_2_ = uVar127;
  auVar272._14_2_ = uVar127;
  uVar127 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar164._12_4_ = auVar272._12_4_;
  auVar164._8_2_ = 0;
  auVar164._0_8_ = uVar74;
  auVar164._10_2_ = uVar127;
  auVar88._10_6_ = auVar164._10_6_;
  auVar88._8_2_ = uVar127;
  auVar88._0_8_ = uVar74;
  uVar127 = (undefined2)uVar40;
  auVar41._4_8_ = auVar88._8_8_;
  auVar41._2_2_ = uVar127;
  auVar41._0_2_ = uVar127;
  fVar330 = (float)((int)sVar85 >> 8);
  fVar339 = (float)(auVar41._0_4_ >> 0x18);
  fVar340 = (float)(auVar88._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 5 + 6);
  uVar126 = (undefined1)((uint)uVar63 >> 0x18);
  uVar127 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar63 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar127,uVar126),CONCAT14(uVar126,uVar63));
  uVar126 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar126),uVar126);
  sVar85 = CONCAT11((char)uVar63,(char)uVar63);
  uVar74 = CONCAT62(uVar40,sVar85);
  auVar136._8_4_ = 0;
  auVar136._0_8_ = uVar74;
  auVar136._12_2_ = uVar127;
  auVar136._14_2_ = uVar127;
  uVar127 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar135._12_4_ = auVar136._12_4_;
  auVar135._8_2_ = 0;
  auVar135._0_8_ = uVar74;
  auVar135._10_2_ = uVar127;
  auVar134._10_6_ = auVar135._10_6_;
  auVar134._8_2_ = uVar127;
  auVar134._0_8_ = uVar74;
  uVar127 = (undefined2)uVar40;
  auVar42._4_8_ = auVar134._8_8_;
  auVar42._2_2_ = uVar127;
  auVar42._0_2_ = uVar127;
  fVar197 = (float)((int)sVar85 >> 8);
  fVar208 = (float)(auVar42._0_4_ >> 0x18);
  fVar209 = (float)(auVar134._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 6 + 6);
  uVar126 = (undefined1)((uint)uVar63 >> 0x18);
  uVar127 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar63 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar127,uVar126),CONCAT14(uVar126,uVar63));
  uVar126 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar126),uVar126);
  sVar85 = CONCAT11((char)uVar63,(char)uVar63);
  uVar74 = CONCAT62(uVar40,sVar85);
  auVar139._8_4_ = 0;
  auVar139._0_8_ = uVar74;
  auVar139._12_2_ = uVar127;
  auVar139._14_2_ = uVar127;
  uVar127 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar138._12_4_ = auVar139._12_4_;
  auVar138._8_2_ = 0;
  auVar138._0_8_ = uVar74;
  auVar138._10_2_ = uVar127;
  auVar137._10_6_ = auVar138._10_6_;
  auVar137._8_2_ = uVar127;
  auVar137._0_8_ = uVar74;
  uVar127 = (undefined2)uVar40;
  auVar43._4_8_ = auVar137._8_8_;
  auVar43._2_2_ = uVar127;
  auVar43._0_2_ = uVar127;
  fVar235 = (float)((int)sVar85 >> 8);
  fVar242 = (float)(auVar43._0_4_ >> 0x18);
  fVar243 = (float)(auVar137._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 0xf + 6);
  uVar126 = (undefined1)((uint)uVar63 >> 0x18);
  uVar127 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar63 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar127,uVar126),CONCAT14(uVar126,uVar63));
  uVar126 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar126),uVar126);
  sVar85 = CONCAT11((char)uVar63,(char)uVar63);
  uVar74 = CONCAT62(uVar40,sVar85);
  auVar142._8_4_ = 0;
  auVar142._0_8_ = uVar74;
  auVar142._12_2_ = uVar127;
  auVar142._14_2_ = uVar127;
  uVar127 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar141._12_4_ = auVar142._12_4_;
  auVar141._8_2_ = 0;
  auVar141._0_8_ = uVar74;
  auVar141._10_2_ = uVar127;
  auVar140._10_6_ = auVar141._10_6_;
  auVar140._8_2_ = uVar127;
  auVar140._0_8_ = uVar74;
  uVar127 = (undefined2)uVar40;
  auVar44._4_8_ = auVar140._8_8_;
  auVar44._2_2_ = uVar127;
  auVar44._0_2_ = uVar127;
  fVar86 = (float)((int)sVar85 >> 8);
  fVar128 = (float)(auVar44._0_4_ >> 0x18);
  fVar130 = (float)(auVar140._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar126 = (undefined1)((uint)uVar63 >> 0x18);
  uVar127 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar63 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar127,uVar126),CONCAT14(uVar126,uVar63));
  uVar126 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar126),uVar126);
  sVar85 = CONCAT11((char)uVar63,(char)uVar63);
  uVar74 = CONCAT62(uVar40,sVar85);
  auVar213._8_4_ = 0;
  auVar213._0_8_ = uVar74;
  auVar213._12_2_ = uVar127;
  auVar213._14_2_ = uVar127;
  uVar127 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar212._12_4_ = auVar213._12_4_;
  auVar212._8_2_ = 0;
  auVar212._0_8_ = uVar74;
  auVar212._10_2_ = uVar127;
  auVar211._10_6_ = auVar212._10_6_;
  auVar211._8_2_ = uVar127;
  auVar211._0_8_ = uVar74;
  uVar127 = (undefined2)uVar40;
  auVar45._4_8_ = auVar211._8_8_;
  auVar45._2_2_ = uVar127;
  auVar45._0_2_ = uVar127;
  fVar245 = (float)((int)sVar85 >> 8);
  fVar258 = (float)(auVar45._0_4_ >> 0x18);
  fVar259 = (float)(auVar211._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + uVar64 + 6);
  uVar126 = (undefined1)((uint)uVar63 >> 0x18);
  uVar127 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar63 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar127,uVar126),CONCAT14(uVar126,uVar63));
  uVar126 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar126),uVar126);
  sVar85 = CONCAT11((char)uVar63,(char)uVar63);
  uVar74 = CONCAT62(uVar40,sVar85);
  auVar216._8_4_ = 0;
  auVar216._0_8_ = uVar74;
  auVar216._12_2_ = uVar127;
  auVar216._14_2_ = uVar127;
  uVar127 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar215._12_4_ = auVar216._12_4_;
  auVar215._8_2_ = 0;
  auVar215._0_8_ = uVar74;
  auVar215._10_2_ = uVar127;
  auVar214._10_6_ = auVar215._10_6_;
  auVar214._8_2_ = uVar127;
  auVar214._0_8_ = uVar74;
  uVar127 = (undefined2)uVar40;
  auVar46._4_8_ = auVar214._8_8_;
  auVar46._2_2_ = uVar127;
  auVar46._0_2_ = uVar127;
  fVar267 = (float)((int)sVar85 >> 8);
  fVar274 = (float)(auVar46._0_4_ >> 0x18);
  fVar277 = (float)(auVar214._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 0x1a + 6);
  uVar126 = (undefined1)((uint)uVar63 >> 0x18);
  uVar127 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar63 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar127,uVar126),CONCAT14(uVar126,uVar63));
  uVar126 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar126),uVar126);
  sVar85 = CONCAT11((char)uVar63,(char)uVar63);
  uVar74 = CONCAT62(uVar40,sVar85);
  auVar219._8_4_ = 0;
  auVar219._0_8_ = uVar74;
  auVar219._12_2_ = uVar127;
  auVar219._14_2_ = uVar127;
  uVar127 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar218._12_4_ = auVar219._12_4_;
  auVar218._8_2_ = 0;
  auVar218._0_8_ = uVar74;
  auVar218._10_2_ = uVar127;
  auVar217._10_6_ = auVar218._10_6_;
  auVar217._8_2_ = uVar127;
  auVar217._0_8_ = uVar74;
  uVar127 = (undefined2)uVar40;
  auVar47._4_8_ = auVar217._8_8_;
  auVar47._2_2_ = uVar127;
  auVar47._0_2_ = uVar127;
  fVar260 = (float)((int)sVar85 >> 8);
  fVar265 = (float)(auVar47._0_4_ >> 0x18);
  fVar266 = (float)(auVar217._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 0x1b + 6);
  uVar126 = (undefined1)((uint)uVar63 >> 0x18);
  uVar127 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar63 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar127,uVar126),CONCAT14(uVar126,uVar63));
  uVar126 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar126),uVar126);
  sVar85 = CONCAT11((char)uVar63,(char)uVar63);
  uVar74 = CONCAT62(uVar40,sVar85);
  auVar222._8_4_ = 0;
  auVar222._0_8_ = uVar74;
  auVar222._12_2_ = uVar127;
  auVar222._14_2_ = uVar127;
  uVar127 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar221._12_4_ = auVar222._12_4_;
  auVar221._8_2_ = 0;
  auVar221._0_8_ = uVar74;
  auVar221._10_2_ = uVar127;
  auVar220._10_6_ = auVar221._10_6_;
  auVar220._8_2_ = uVar127;
  auVar220._0_8_ = uVar74;
  uVar127 = (undefined2)uVar40;
  auVar48._4_8_ = auVar220._8_8_;
  auVar48._2_2_ = uVar127;
  auVar48._0_2_ = uVar127;
  fVar282 = (float)((int)sVar85 >> 8);
  fVar293 = (float)(auVar48._0_4_ >> 0x18);
  fVar295 = (float)(auVar220._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 0x1c + 6);
  uVar126 = (undefined1)((uint)uVar63 >> 0x18);
  uVar127 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar63 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar127,uVar126),CONCAT14(uVar126,uVar63));
  uVar126 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar126),uVar126);
  sVar85 = CONCAT11((char)uVar63,(char)uVar63);
  uVar74 = CONCAT62(uVar40,sVar85);
  auVar225._8_4_ = 0;
  auVar225._0_8_ = uVar74;
  auVar225._12_2_ = uVar127;
  auVar225._14_2_ = uVar127;
  uVar127 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar224._12_4_ = auVar225._12_4_;
  auVar224._8_2_ = 0;
  auVar224._0_8_ = uVar74;
  auVar224._10_2_ = uVar127;
  auVar223._10_6_ = auVar224._10_6_;
  auVar223._8_2_ = uVar127;
  auVar223._0_8_ = uVar74;
  uVar127 = (undefined2)uVar40;
  auVar49._4_8_ = auVar223._8_8_;
  auVar49._2_2_ = uVar127;
  auVar49._0_2_ = uVar127;
  fVar133 = (float)((int)sVar85 >> 8);
  fVar160 = (float)(auVar49._0_4_ >> 0x18);
  fVar161 = (float)(auVar223._8_4_ >> 0x18);
  fVar312 = fVar162 * fVar330 + fVar174 * fVar197 + fVar175 * fVar235;
  fVar321 = fVar162 * fVar339 + fVar174 * fVar208 + fVar175 * fVar242;
  fVar324 = fVar162 * fVar340 + fVar174 * fVar209 + fVar175 * fVar243;
  fVar327 = fVar162 * (float)(auVar164._12_4_ >> 0x18) +
            fVar174 * (float)(auVar135._12_4_ >> 0x18) + fVar175 * (float)(auVar138._12_4_ >> 0x18);
  fVar298 = fVar162 * fVar86 + fVar174 * fVar245 + fVar175 * fVar267;
  fVar306 = fVar162 * fVar128 + fVar174 * fVar258 + fVar175 * fVar274;
  fVar308 = fVar162 * fVar130 + fVar174 * fVar259 + fVar175 * fVar277;
  fVar310 = fVar162 * (float)(auVar141._12_4_ >> 0x18) +
            fVar174 * (float)(auVar212._12_4_ >> 0x18) + fVar175 * (float)(auVar215._12_4_ >> 0x18);
  fVar210 = fVar162 * fVar260 + fVar174 * fVar282 + fVar175 * fVar133;
  fVar233 = fVar162 * fVar265 + fVar174 * fVar293 + fVar175 * fVar160;
  fVar234 = fVar162 * fVar266 + fVar174 * fVar295 + fVar175 * fVar161;
  fVar175 = fVar162 * (float)(auVar218._12_4_ >> 0x18) +
            fVar174 * (float)(auVar221._12_4_ >> 0x18) + fVar175 * (float)(auVar224._12_4_ >> 0x18);
  fVar331 = fVar330 * fVar176 + fVar197 * fVar195 + fVar235 * fVar196;
  fVar339 = fVar339 * fVar176 + fVar208 * fVar195 + fVar242 * fVar196;
  fVar340 = fVar340 * fVar176 + fVar209 * fVar195 + fVar243 * fVar196;
  fVar341 = (float)(auVar164._12_4_ >> 0x18) * fVar176 +
            (float)(auVar135._12_4_ >> 0x18) * fVar195 + (float)(auVar138._12_4_ >> 0x18) * fVar196;
  fVar267 = fVar86 * fVar176 + fVar245 * fVar195 + fVar267 * fVar196;
  fVar274 = fVar128 * fVar176 + fVar258 * fVar195 + fVar274 * fVar196;
  fVar277 = fVar130 * fVar176 + fVar259 * fVar195 + fVar277 * fVar196;
  fVar330 = (float)(auVar141._12_4_ >> 0x18) * fVar176 +
            (float)(auVar212._12_4_ >> 0x18) * fVar195 + (float)(auVar215._12_4_ >> 0x18) * fVar196;
  fVar260 = fVar176 * fVar260 + fVar195 * fVar282 + fVar196 * fVar133;
  fVar265 = fVar176 * fVar265 + fVar195 * fVar293 + fVar196 * fVar160;
  fVar266 = fVar176 * fVar266 + fVar195 * fVar295 + fVar196 * fVar161;
  fVar282 = fVar176 * (float)(auVar218._12_4_ >> 0x18) +
            fVar195 * (float)(auVar221._12_4_ >> 0x18) + fVar196 * (float)(auVar224._12_4_ >> 0x18);
  uVar87 = (uint)DAT_01fec6c0;
  uVar129 = DAT_01fec6c0._4_4_;
  uVar131 = DAT_01fec6c0._8_4_;
  uVar132 = DAT_01fec6c0._12_4_;
  uVar80 = -(uint)(1e-18 <= (float)((uint)fVar312 & uVar87));
  uVar81 = -(uint)(1e-18 <= (float)((uint)fVar321 & uVar129));
  uVar82 = -(uint)(1e-18 <= (float)((uint)fVar324 & uVar131));
  uVar83 = -(uint)(1e-18 <= (float)((uint)fVar327 & uVar132));
  auVar315._0_4_ = (uint)fVar312 & uVar80;
  auVar315._4_4_ = (uint)fVar321 & uVar81;
  auVar315._8_4_ = (uint)fVar324 & uVar82;
  auVar315._12_4_ = (uint)fVar327 & uVar83;
  auVar177._0_8_ = CONCAT44(~uVar81,~uVar80) & 0x219392ef219392ef;
  auVar177._8_4_ = ~uVar82 & 0x219392ef;
  auVar177._12_4_ = ~uVar83 & 0x219392ef;
  auVar177 = auVar177 | auVar315;
  uVar80 = -(uint)(1e-18 <= (float)((uint)fVar298 & uVar87));
  uVar81 = -(uint)(1e-18 <= (float)((uint)fVar306 & uVar129));
  uVar82 = -(uint)(1e-18 <= (float)((uint)fVar308 & uVar131));
  uVar83 = -(uint)(1e-18 <= (float)((uint)fVar310 & uVar132));
  auVar299._0_4_ = (uint)fVar298 & uVar80;
  auVar299._4_4_ = (uint)fVar306 & uVar81;
  auVar299._8_4_ = (uint)fVar308 & uVar82;
  auVar299._12_4_ = (uint)fVar310 & uVar83;
  auVar236._0_8_ = CONCAT44(~uVar81,~uVar80) & 0x219392ef219392ef;
  auVar236._8_4_ = ~uVar82 & 0x219392ef;
  auVar236._12_4_ = ~uVar83 & 0x219392ef;
  auVar236 = auVar236 | auVar299;
  uVar80 = -(uint)(1e-18 <= (float)((uint)fVar210 & uVar87));
  uVar81 = -(uint)(1e-18 <= (float)((uint)fVar233 & uVar129));
  uVar82 = -(uint)(1e-18 <= (float)((uint)fVar234 & uVar131));
  uVar83 = -(uint)(1e-18 <= (float)((uint)fVar175 & uVar132));
  auVar226._0_4_ = (uint)fVar210 & uVar80;
  auVar226._4_4_ = (uint)fVar233 & uVar81;
  auVar226._8_4_ = (uint)fVar234 & uVar82;
  auVar226._12_4_ = (uint)fVar175 & uVar83;
  auVar246._0_8_ = CONCAT44(~uVar81,~uVar80) & 0x219392ef219392ef;
  auVar246._8_4_ = ~uVar82 & 0x219392ef;
  auVar246._12_4_ = ~uVar83 & 0x219392ef;
  auVar246 = auVar246 | auVar226;
  auVar88 = rcpps(_DAT_01fec6c0,auVar177);
  fVar175 = auVar88._0_4_;
  fVar130 = auVar88._4_4_;
  fVar197 = auVar88._8_4_;
  fVar245 = auVar88._12_4_;
  fVar175 = (1.0 - auVar177._0_4_ * fVar175) * fVar175 + fVar175;
  fVar130 = (1.0 - auVar177._4_4_ * fVar130) * fVar130 + fVar130;
  fVar197 = (1.0 - auVar177._8_4_ * fVar197) * fVar197 + fVar197;
  fVar245 = (1.0 - auVar177._12_4_ * fVar245) * fVar245 + fVar245;
  auVar88 = rcpps(auVar88,auVar236);
  fVar86 = auVar88._0_4_;
  fVar133 = auVar88._4_4_;
  fVar208 = auVar88._8_4_;
  fVar258 = auVar88._12_4_;
  fVar86 = (1.0 - auVar236._0_4_ * fVar86) * fVar86 + fVar86;
  fVar133 = (1.0 - auVar236._4_4_ * fVar133) * fVar133 + fVar133;
  fVar208 = (1.0 - auVar236._8_4_ * fVar208) * fVar208 + fVar208;
  fVar258 = (1.0 - auVar236._12_4_ * fVar258) * fVar258 + fVar258;
  auVar88 = rcpps(auVar88,auVar246);
  fVar128 = auVar88._0_4_;
  fVar160 = auVar88._4_4_;
  fVar209 = auVar88._8_4_;
  fVar259 = auVar88._12_4_;
  fVar128 = (1.0 - auVar246._0_4_ * fVar128) * fVar128 + fVar128;
  fVar160 = (1.0 - auVar246._4_4_ * fVar160) * fVar160 + fVar160;
  fVar209 = (1.0 - auVar246._8_4_ * fVar209) * fVar209 + fVar209;
  fVar259 = (1.0 - auVar246._12_4_ * fVar259) * fVar259 + fVar259;
  fVar293 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar65 + 0x16)) *
            *(float *)(prim + lVar65 + 0x1a);
  uVar74 = *(ulong *)(prim + uVar64 * 7 + 6);
  uVar127 = (undefined2)(uVar74 >> 0x30);
  auVar238._8_4_ = 0;
  auVar238._0_8_ = uVar74;
  auVar238._12_2_ = uVar127;
  auVar238._14_2_ = uVar127;
  uVar127 = (undefined2)(uVar74 >> 0x20);
  auVar183._12_4_ = auVar238._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar74;
  auVar183._10_2_ = uVar127;
  auVar166._10_6_ = auVar183._10_6_;
  auVar166._8_2_ = uVar127;
  auVar166._0_8_ = uVar74;
  uVar127 = (undefined2)(uVar74 >> 0x10);
  auVar50._4_8_ = auVar166._8_8_;
  auVar50._2_2_ = uVar127;
  auVar50._0_2_ = uVar127;
  fVar161 = (float)(auVar50._0_4_ >> 0x10);
  fVar210 = (float)(auVar166._8_4_ >> 0x10);
  uVar68 = *(ulong *)(prim + uVar64 * 0xb + 6);
  uVar127 = (undefined2)(uVar68 >> 0x30);
  auVar180._8_4_ = 0;
  auVar180._0_8_ = uVar68;
  auVar180._12_2_ = uVar127;
  auVar180._14_2_ = uVar127;
  uVar127 = (undefined2)(uVar68 >> 0x20);
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._8_2_ = 0;
  auVar179._0_8_ = uVar68;
  auVar179._10_2_ = uVar127;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._8_2_ = uVar127;
  auVar178._0_8_ = uVar68;
  uVar127 = (undefined2)(uVar68 >> 0x10);
  auVar51._4_8_ = auVar178._8_8_;
  auVar51._2_2_ = uVar127;
  auVar51._0_2_ = uVar127;
  uVar10 = *(ulong *)(prim + uVar64 * 9 + 6);
  uVar127 = (undefined2)(uVar10 >> 0x30);
  auVar91._8_4_ = 0;
  auVar91._0_8_ = uVar10;
  auVar91._12_2_ = uVar127;
  auVar91._14_2_ = uVar127;
  uVar127 = (undefined2)(uVar10 >> 0x20);
  auVar90._12_4_ = auVar91._12_4_;
  auVar90._8_2_ = 0;
  auVar90._0_8_ = uVar10;
  auVar90._10_2_ = uVar127;
  auVar89._10_6_ = auVar90._10_6_;
  auVar89._8_2_ = uVar127;
  auVar89._0_8_ = uVar10;
  uVar127 = (undefined2)(uVar10 >> 0x10);
  auVar52._4_8_ = auVar89._8_8_;
  auVar52._2_2_ = uVar127;
  auVar52._0_2_ = uVar127;
  fVar162 = (float)(auVar52._0_4_ >> 0x10);
  fVar233 = (float)(auVar89._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar64 * 0xd + 6);
  uVar127 = (undefined2)(uVar11 >> 0x30);
  auVar249._8_4_ = 0;
  auVar249._0_8_ = uVar11;
  auVar249._12_2_ = uVar127;
  auVar249._14_2_ = uVar127;
  uVar127 = (undefined2)(uVar11 >> 0x20);
  auVar248._12_4_ = auVar249._12_4_;
  auVar248._8_2_ = 0;
  auVar248._0_8_ = uVar11;
  auVar248._10_2_ = uVar127;
  auVar247._10_6_ = auVar248._10_6_;
  auVar247._8_2_ = uVar127;
  auVar247._0_8_ = uVar11;
  uVar127 = (undefined2)(uVar11 >> 0x10);
  auVar53._4_8_ = auVar247._8_8_;
  auVar53._2_2_ = uVar127;
  auVar53._0_2_ = uVar127;
  uVar12 = *(ulong *)(prim + uVar64 * 0x12 + 6);
  uVar127 = (undefined2)(uVar12 >> 0x30);
  auVar94._8_4_ = 0;
  auVar94._0_8_ = uVar12;
  auVar94._12_2_ = uVar127;
  auVar94._14_2_ = uVar127;
  uVar127 = (undefined2)(uVar12 >> 0x20);
  auVar93._12_4_ = auVar94._12_4_;
  auVar93._8_2_ = 0;
  auVar93._0_8_ = uVar12;
  auVar93._10_2_ = uVar127;
  auVar92._10_6_ = auVar93._10_6_;
  auVar92._8_2_ = uVar127;
  auVar92._0_8_ = uVar12;
  uVar127 = (undefined2)(uVar12 >> 0x10);
  auVar54._4_8_ = auVar92._8_8_;
  auVar54._2_2_ = uVar127;
  auVar54._0_2_ = uVar127;
  fVar174 = (float)(auVar54._0_4_ >> 0x10);
  fVar234 = (float)(auVar92._8_4_ >> 0x10);
  uVar71 = (ulong)(uint)((int)(uVar64 * 5) << 2);
  uVar13 = *(ulong *)(prim + uVar64 * 2 + uVar71 + 6);
  uVar127 = (undefined2)(uVar13 >> 0x30);
  auVar270._8_4_ = 0;
  auVar270._0_8_ = uVar13;
  auVar270._12_2_ = uVar127;
  auVar270._14_2_ = uVar127;
  uVar127 = (undefined2)(uVar13 >> 0x20);
  auVar269._12_4_ = auVar270._12_4_;
  auVar269._8_2_ = 0;
  auVar269._0_8_ = uVar13;
  auVar269._10_2_ = uVar127;
  auVar268._10_6_ = auVar269._10_6_;
  auVar268._8_2_ = uVar127;
  auVar268._0_8_ = uVar13;
  uVar127 = (undefined2)(uVar13 >> 0x10);
  auVar55._4_8_ = auVar268._8_8_;
  auVar55._2_2_ = uVar127;
  auVar55._0_2_ = uVar127;
  uVar71 = *(ulong *)(prim + uVar71 + 6);
  uVar127 = (undefined2)(uVar71 >> 0x30);
  auVar97._8_4_ = 0;
  auVar97._0_8_ = uVar71;
  auVar97._12_2_ = uVar127;
  auVar97._14_2_ = uVar127;
  uVar127 = (undefined2)(uVar71 >> 0x20);
  auVar96._12_4_ = auVar97._12_4_;
  auVar96._8_2_ = 0;
  auVar96._0_8_ = uVar71;
  auVar96._10_2_ = uVar127;
  auVar95._10_6_ = auVar96._10_6_;
  auVar95._8_2_ = uVar127;
  auVar95._0_8_ = uVar71;
  uVar127 = (undefined2)(uVar71 >> 0x10);
  auVar56._4_8_ = auVar95._8_8_;
  auVar56._2_2_ = uVar127;
  auVar56._0_2_ = uVar127;
  fVar176 = (float)(auVar56._0_4_ >> 0x10);
  fVar235 = (float)(auVar95._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar64 * 0x18 + 6);
  uVar127 = (undefined2)(uVar14 >> 0x30);
  auVar286._8_4_ = 0;
  auVar286._0_8_ = uVar14;
  auVar286._12_2_ = uVar127;
  auVar286._14_2_ = uVar127;
  uVar127 = (undefined2)(uVar14 >> 0x20);
  auVar285._12_4_ = auVar286._12_4_;
  auVar285._8_2_ = 0;
  auVar285._0_8_ = uVar14;
  auVar285._10_2_ = uVar127;
  auVar284._10_6_ = auVar285._10_6_;
  auVar284._8_2_ = uVar127;
  auVar284._0_8_ = uVar14;
  uVar127 = (undefined2)(uVar14 >> 0x10);
  auVar57._4_8_ = auVar284._8_8_;
  auVar57._2_2_ = uVar127;
  auVar57._0_2_ = uVar127;
  uVar15 = *(ulong *)(prim + uVar64 * 0x1d + 6);
  uVar127 = (undefined2)(uVar15 >> 0x30);
  auVar100._8_4_ = 0;
  auVar100._0_8_ = uVar15;
  auVar100._12_2_ = uVar127;
  auVar100._14_2_ = uVar127;
  uVar127 = (undefined2)(uVar15 >> 0x20);
  auVar99._12_4_ = auVar100._12_4_;
  auVar99._8_2_ = 0;
  auVar99._0_8_ = uVar15;
  auVar99._10_2_ = uVar127;
  auVar98._10_6_ = auVar99._10_6_;
  auVar98._8_2_ = uVar127;
  auVar98._0_8_ = uVar15;
  uVar127 = (undefined2)(uVar15 >> 0x10);
  auVar58._4_8_ = auVar98._8_8_;
  auVar58._2_2_ = uVar127;
  auVar58._0_2_ = uVar127;
  fVar195 = (float)(auVar58._0_4_ >> 0x10);
  fVar242 = (float)(auVar98._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar64 + (ulong)(byte)PVar18 * 0x20 + 6);
  uVar127 = (undefined2)(uVar16 >> 0x30);
  auVar302._8_4_ = 0;
  auVar302._0_8_ = uVar16;
  auVar302._12_2_ = uVar127;
  auVar302._14_2_ = uVar127;
  uVar127 = (undefined2)(uVar16 >> 0x20);
  auVar301._12_4_ = auVar302._12_4_;
  auVar301._8_2_ = 0;
  auVar301._0_8_ = uVar16;
  auVar301._10_2_ = uVar127;
  auVar300._10_6_ = auVar301._10_6_;
  auVar300._8_2_ = uVar127;
  auVar300._0_8_ = uVar16;
  uVar127 = (undefined2)(uVar16 >> 0x10);
  auVar59._4_8_ = auVar300._8_8_;
  auVar59._2_2_ = uVar127;
  auVar59._0_2_ = uVar127;
  uVar17 = *(ulong *)(prim + ((ulong)(byte)PVar18 * 0x20 - uVar64) + 6);
  uVar127 = (undefined2)(uVar17 >> 0x30);
  auVar103._8_4_ = 0;
  auVar103._0_8_ = uVar17;
  auVar103._12_2_ = uVar127;
  auVar103._14_2_ = uVar127;
  uVar127 = (undefined2)(uVar17 >> 0x20);
  auVar102._12_4_ = auVar103._12_4_;
  auVar102._8_2_ = 0;
  auVar102._0_8_ = uVar17;
  auVar102._10_2_ = uVar127;
  auVar101._10_6_ = auVar102._10_6_;
  auVar101._8_2_ = uVar127;
  auVar101._0_8_ = uVar17;
  uVar127 = (undefined2)(uVar17 >> 0x10);
  auVar60._4_8_ = auVar101._8_8_;
  auVar60._2_2_ = uVar127;
  auVar60._0_2_ = uVar127;
  fVar196 = (float)(auVar60._0_4_ >> 0x10);
  fVar243 = (float)(auVar101._8_4_ >> 0x10);
  uVar64 = *(ulong *)(prim + uVar64 * 0x23 + 6);
  uVar127 = (undefined2)(uVar64 >> 0x30);
  auVar318._8_4_ = 0;
  auVar318._0_8_ = uVar64;
  auVar318._12_2_ = uVar127;
  auVar318._14_2_ = uVar127;
  uVar127 = (undefined2)(uVar64 >> 0x20);
  auVar317._12_4_ = auVar318._12_4_;
  auVar317._8_2_ = 0;
  auVar317._0_8_ = uVar64;
  auVar317._10_2_ = uVar127;
  auVar316._10_6_ = auVar317._10_6_;
  auVar316._8_2_ = uVar127;
  auVar316._0_8_ = uVar64;
  uVar127 = (undefined2)(uVar64 >> 0x10);
  auVar61._4_8_ = auVar316._8_8_;
  auVar61._2_2_ = uVar127;
  auVar61._0_2_ = uVar127;
  auVar181._0_8_ =
       CONCAT44(((((float)(auVar51._0_4_ >> 0x10) - fVar161) * fVar293 + fVar161) - fVar339) *
                fVar130,((((float)(int)(short)uVar68 - (float)(int)(short)uVar74) * fVar293 +
                         (float)(int)(short)uVar74) - fVar331) * fVar175);
  auVar181._8_4_ =
       ((((float)(auVar178._8_4_ >> 0x10) - fVar210) * fVar293 + fVar210) - fVar340) * fVar197;
  auVar181._12_4_ =
       ((((float)(auVar179._12_4_ >> 0x10) - (float)(auVar183._12_4_ >> 0x10)) * fVar293 +
        (float)(auVar183._12_4_ >> 0x10)) - fVar341) * fVar245;
  auVar250._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar293 +
        (float)(int)(short)uVar10) - fVar331) * fVar175;
  auVar250._4_4_ =
       ((((float)(auVar53._0_4_ >> 0x10) - fVar162) * fVar293 + fVar162) - fVar339) * fVar130;
  auVar250._8_4_ =
       ((((float)(auVar247._8_4_ >> 0x10) - fVar233) * fVar293 + fVar233) - fVar340) * fVar197;
  auVar250._12_4_ =
       ((((float)(auVar248._12_4_ >> 0x10) - (float)(auVar90._12_4_ >> 0x10)) * fVar293 +
        (float)(auVar90._12_4_ >> 0x10)) - fVar341) * fVar245;
  auVar271._0_8_ =
       CONCAT44(((((float)(auVar55._0_4_ >> 0x10) - fVar174) * fVar293 + fVar174) - fVar274) *
                fVar133,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar293 +
                         (float)(int)(short)uVar12) - fVar267) * fVar86);
  auVar271._8_4_ =
       ((((float)(auVar268._8_4_ >> 0x10) - fVar234) * fVar293 + fVar234) - fVar277) * fVar208;
  auVar271._12_4_ =
       ((((float)(auVar269._12_4_ >> 0x10) - (float)(auVar93._12_4_ >> 0x10)) * fVar293 +
        (float)(auVar93._12_4_ >> 0x10)) - fVar330) * fVar258;
  auVar287._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar71) * fVar293 +
        (float)(int)(short)uVar71) - fVar267) * fVar86;
  auVar287._4_4_ =
       ((((float)(auVar57._0_4_ >> 0x10) - fVar176) * fVar293 + fVar176) - fVar274) * fVar133;
  auVar287._8_4_ =
       ((((float)(auVar284._8_4_ >> 0x10) - fVar235) * fVar293 + fVar235) - fVar277) * fVar208;
  auVar287._12_4_ =
       ((((float)(auVar285._12_4_ >> 0x10) - (float)(auVar96._12_4_ >> 0x10)) * fVar293 +
        (float)(auVar96._12_4_ >> 0x10)) - fVar330) * fVar258;
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar303._0_8_ =
       CONCAT44(((((float)(auVar59._0_4_ >> 0x10) - fVar195) * fVar293 + fVar195) - fVar265) *
                fVar160,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar293 +
                         (float)(int)(short)uVar15) - fVar260) * fVar128);
  auVar303._8_4_ =
       ((((float)(auVar300._8_4_ >> 0x10) - fVar242) * fVar293 + fVar242) - fVar266) * fVar209;
  auVar303._12_4_ =
       ((((float)(auVar301._12_4_ >> 0x10) - (float)(auVar99._12_4_ >> 0x10)) * fVar293 +
        (float)(auVar99._12_4_ >> 0x10)) - fVar282) * fVar259;
  auVar319._0_4_ =
       ((((float)(int)(short)uVar64 - (float)(int)(short)uVar17) * fVar293 +
        (float)(int)(short)uVar17) - fVar260) * fVar128;
  auVar319._4_4_ =
       ((((float)(auVar61._0_4_ >> 0x10) - fVar196) * fVar293 + fVar196) - fVar265) * fVar160;
  auVar319._8_4_ =
       ((((float)(auVar316._8_4_ >> 0x10) - fVar243) * fVar293 + fVar243) - fVar266) * fVar209;
  auVar319._12_4_ =
       ((((float)(auVar317._12_4_ >> 0x10) - (float)(auVar102._12_4_ >> 0x10)) * fVar293 +
        (float)(auVar102._12_4_ >> 0x10)) - fVar282) * fVar259;
  auVar163._8_4_ = auVar181._8_4_;
  auVar163._0_8_ = auVar181._0_8_;
  auVar163._12_4_ = auVar181._12_4_;
  auVar164 = minps(auVar163,auVar250);
  auVar143._8_4_ = auVar271._8_4_;
  auVar143._0_8_ = auVar271._0_8_;
  auVar143._12_4_ = auVar271._12_4_;
  auVar88 = minps(auVar143,auVar287);
  auVar164 = maxps(auVar164,auVar88);
  auVar144._8_4_ = auVar303._8_4_;
  auVar144._0_8_ = auVar303._0_8_;
  auVar144._12_4_ = auVar303._12_4_;
  auVar88 = minps(auVar144,auVar319);
  auVar104._4_4_ = uVar63;
  auVar104._0_4_ = uVar63;
  auVar104._8_4_ = uVar63;
  auVar104._12_4_ = uVar63;
  auVar88 = maxps(auVar88,auVar104);
  auVar88 = maxps(auVar164,auVar88);
  auVar164 = maxps(auVar181,auVar250);
  auVar272 = maxps(auVar271,auVar287);
  auVar164 = minps(auVar164,auVar272);
  auVar272 = maxps(auVar303,auVar319);
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar105._4_4_ = uVar63;
  auVar105._0_4_ = uVar63;
  auVar105._8_4_ = uVar63;
  auVar105._12_4_ = uVar63;
  auVar272 = minps(auVar272,auVar105);
  local_1b8 = auVar88._0_4_ * 0.99999964;
  fStack_1b4 = auVar88._4_4_ * 0.99999964;
  fStack_1b0 = auVar88._8_4_ * 0.99999964;
  fStack_1ac = auVar88._12_4_ * 0.99999964;
  auVar88 = minps(auVar164,auVar272);
  uVar80 = (uint)(byte)PVar18;
  auVar106._0_4_ = -(uint)(local_1b8 <= auVar88._0_4_ * 1.0000004 && uVar80 != 0);
  auVar106._4_4_ = -(uint)(fStack_1b4 <= auVar88._4_4_ * 1.0000004 && 1 < uVar80);
  auVar106._8_4_ = -(uint)(fStack_1b0 <= auVar88._8_4_ * 1.0000004 && 2 < uVar80);
  auVar106._12_4_ = -(uint)(fStack_1ac <= auVar88._12_4_ * 1.0000004 && 3 < uVar80);
  uVar80 = movmskps(uVar80,auVar106);
  local_6a9 = uVar80 != 0;
  if (uVar80 == 0) {
    return local_6a9;
  }
  uVar80 = uVar80 & 0xff;
  local_178._0_12_ = mm_lookupmask_ps._240_12_;
  local_178._12_4_ = 0;
  local_438 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_378 = prim;
LAB_00be1aaf:
  local_370 = (ulong)uVar80;
  lVar65 = 0;
  if (local_370 != 0) {
    for (; (uVar80 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
    }
  }
  uVar80 = *(uint *)(local_378 + 2);
  uVar74 = (ulong)uVar80;
  uVar81 = *(uint *)(local_378 + lVar65 * 4 + 6);
  pGVar19 = (context->scene->geometries).items[uVar74].ptr;
  uVar68 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                           (ulong)uVar81 *
                           pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar175 = pGVar19->fnumTimeSegments;
  fVar86 = (pGVar19->time_range).lower;
  fVar128 = ((*(float *)(ray + k * 4 + 0x70) - fVar86) / ((pGVar19->time_range).upper - fVar86)) *
            fVar175;
  fVar86 = floorf(fVar128);
  fVar175 = fVar175 + -1.0;
  if (fVar175 <= fVar86) {
    fVar86 = fVar175;
  }
  fVar175 = 0.0;
  if (0.0 <= fVar86) {
    fVar175 = fVar86;
  }
  _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar72 = (long)(int)fVar175 * 0x38;
  lVar65 = *(long *)(_Var20 + 0x10 + lVar72);
  lVar76 = lVar65 * uVar68;
  pRVar77 = (RTCFilterFunctionNArguments *)(uVar68 + 3);
  lVar79 = *(long *)(_Var20 + 0x38 + lVar72);
  lVar21 = *(long *)(_Var20 + 0x48 + lVar72);
  pfVar1 = (float *)(lVar79 + uVar68 * lVar21);
  pfVar2 = (float *)(lVar79 + (uVar68 + 1) * lVar21);
  pfVar3 = (float *)(lVar79 + (uVar68 + 2) * lVar21);
  fVar128 = fVar128 - fVar175;
  fVar161 = 1.0 - fVar128;
  pfVar4 = (float *)(lVar79 + lVar21 * (long)pRVar77);
  pRVar70 = *(RTCIntersectArguments **)(_Var20 + lVar72);
  ppSVar5 = (Scene **)((long)&pRVar70->flags + lVar76);
  ppSVar6 = (Scene **)((long)&pRVar70->flags + lVar65 * (uVar68 + 1));
  ppSVar7 = (Scene **)((long)&pRVar70->flags + lVar65 * (uVar68 + 2));
  fVar162 = *(float *)ppSVar5 * fVar161 + *pfVar1 * fVar128;
  fVar174 = *(float *)((long)ppSVar5 + 4) * fVar161 + pfVar1[1] * fVar128;
  fVar176 = *(float *)(ppSVar5 + 1) * fVar161 + pfVar1[2] * fVar128;
  local_528 = *(float *)ppSVar6 * fVar161 + *pfVar2 * fVar128;
  fStack_524 = *(float *)((long)ppSVar6 + 4) * fVar161 + pfVar2[1] * fVar128;
  fStack_520 = *(float *)(ppSVar6 + 1) * fVar161 + pfVar2[2] * fVar128;
  local_538 = *(float *)ppSVar7 * fVar161 + *pfVar3 * fVar128;
  fStack_534 = *(float *)((long)ppSVar7 + 4) * fVar161 + pfVar3[1] * fVar128;
  fStack_530 = *(float *)(ppSVar7 + 1) * fVar161 + pfVar3[2] * fVar128;
  ppSVar8 = (Scene **)((long)&pRVar70->flags + lVar65 * (long)pRVar77);
  local_608._0_4_ = fVar161 * *(float *)ppSVar8 + fVar128 * *pfVar4;
  local_608._4_4_ = fVar161 * *(float *)((long)ppSVar8 + 4) + fVar128 * pfVar4[1];
  fStack_600 = fVar161 * *(float *)(ppSVar8 + 1) + fVar128 * pfVar4[2];
  fStack_11c = *(float *)(ray + k * 4 + 0x40);
  fVar175 = *(float *)(ray + k * 4 + 0x50);
  local_5d8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x60);
  local_3f8._4_4_ = fVar175;
  local_3f8._0_4_ = fStack_11c;
  fStack_3f0 = (float)local_5d8._4_4_;
  fStack_3ec = 0.0;
  fVar86 = fVar175 * fVar175;
  fVar130 = (float)local_5d8._4_4_ * (float)local_5d8._4_4_;
  fVar196 = fVar86 + fStack_11c * fStack_11c + fVar130;
  local_408._0_8_ = CONCAT44(fVar86 + fVar86 + 0.0,fVar196);
  local_408._8_4_ = fVar86 + fVar130 + fVar130;
  local_408._12_4_ = fVar86 + 0.0 + 0.0;
  auVar198._8_4_ = local_408._8_4_;
  auVar198._0_8_ = local_408._0_8_;
  auVar198._12_4_ = local_408._12_4_;
  auVar88 = rcpss(auVar198,local_408);
  local_548 = (2.0 - fVar196 * auVar88._0_4_) * auVar88._0_4_ *
              (((fVar176 + fStack_520 + fStack_530 + fStack_600) * 0.25 -
               *(float *)(ray + k * 4 + 0x20)) * (float)local_5d8._4_4_ +
              ((fVar174 + fStack_524 + fStack_534 + (float)local_608._4_4_) * 0.25 -
              *(float *)(ray + k * 4 + 0x10)) * fVar175 +
              ((fVar162 + local_528 + local_538 + (float)local_608._0_4_) * 0.25 -
              *(float *)(ray + k * 4)) * fStack_11c);
  fVar86 = fStack_11c * local_548 + *(float *)(ray + k * 4);
  fVar133 = fVar175 * local_548 + *(float *)(ray + k * 4 + 0x10);
  fVar160 = (float)local_5d8._4_4_ * local_548 + *(float *)(ray + k * 4 + 0x20);
  fVar162 = fVar162 - fVar86;
  fVar174 = fVar174 - fVar133;
  fVar176 = fVar176 - fVar160;
  fVar195 = (*(float *)((long)ppSVar5 + 0xc) * fVar161 + pfVar1[3] * fVar128) - 0.0;
  local_538 = local_538 - fVar86;
  fStack_534 = fStack_534 - fVar133;
  fStack_530 = fStack_530 - fVar160;
  fStack_52c = (*(float *)((long)ppSVar7 + 0xc) * fVar161 + pfVar3[3] * fVar128) - 0.0;
  local_528 = local_528 - fVar86;
  fStack_524 = fStack_524 - fVar133;
  fStack_520 = fStack_520 - fVar160;
  fStack_51c = (*(float *)((long)ppSVar6 + 0xc) * fVar161 + pfVar2[3] * fVar128) - 0.0;
  local_608._0_4_ = (float)local_608._0_4_ - fVar86;
  local_608._4_4_ = (float)local_608._4_4_ - fVar133;
  fStack_600 = fStack_600 - fVar160;
  fStack_5fc = (fVar161 * *(float *)((long)ppSVar8 + 0xc) + fVar128 * pfVar4[3]) - 0.0;
  local_278 = fVar162;
  fStack_274 = fVar162;
  fStack_270 = fVar162;
  fStack_26c = fVar162;
  local_288 = fVar174;
  fStack_284 = fVar174;
  fStack_280 = fVar174;
  fStack_27c = fVar174;
  local_138 = fVar176;
  fStack_134 = fVar176;
  fStack_130 = fVar176;
  fStack_12c = fVar176;
  fVar86 = fVar175 * fVar175;
  local_298 = fVar195;
  fStack_294 = fVar195;
  fStack_290 = fVar195;
  fStack_28c = fVar195;
  fStack_11c = fStack_11c * fStack_11c;
  local_128 = fStack_11c + fVar86 + fVar130;
  fStack_124 = fStack_11c + fVar86 + fVar130;
  fStack_120 = fStack_11c + fVar86 + fVar130;
  fStack_11c = fStack_11c + fVar86 + fVar130;
  local_2a8 = local_528;
  fStack_2a4 = local_528;
  fStack_2a0 = local_528;
  fStack_29c = local_528;
  local_148 = fStack_524;
  fStack_144 = fStack_524;
  fStack_140 = fStack_524;
  fStack_13c = fStack_524;
  local_2b8 = fStack_520;
  fStack_2b4 = fStack_520;
  fStack_2b0 = fStack_520;
  fStack_2ac = fStack_520;
  local_2c8 = fStack_51c;
  fStack_2c4 = fStack_51c;
  fStack_2c0 = fStack_51c;
  fStack_2bc = fStack_51c;
  local_2d8 = local_538;
  fStack_2d4 = local_538;
  fStack_2d0 = local_538;
  fStack_2cc = local_538;
  local_2e8 = fStack_534;
  fStack_2e4 = fStack_534;
  fStack_2e0 = fStack_534;
  fStack_2dc = fStack_534;
  local_2f8 = fStack_530;
  fStack_2f4 = fStack_530;
  fStack_2f0 = fStack_530;
  fStack_2ec = fStack_530;
  local_308 = fStack_52c;
  fStack_304 = fStack_52c;
  fStack_300 = fStack_52c;
  fStack_2fc = fStack_52c;
  local_158 = (float)local_608._0_4_;
  fStack_154 = (float)local_608._0_4_;
  fStack_150 = (float)local_608._0_4_;
  fStack_14c = (float)local_608._0_4_;
  local_318 = (float)local_608._4_4_;
  fStack_314 = (float)local_608._4_4_;
  fStack_310 = (float)local_608._4_4_;
  fStack_30c = (float)local_608._4_4_;
  local_328 = fStack_600;
  fStack_324 = fStack_600;
  fStack_320 = fStack_600;
  fStack_31c = fStack_600;
  local_338 = fStack_5fc;
  fStack_334 = fStack_5fc;
  fStack_330 = fStack_5fc;
  fStack_32c = fStack_5fc;
  local_418 = *(float *)(ray + k * 4 + 0x40);
  fStack_414 = local_418;
  fStack_410 = local_418;
  fStack_40c = local_418;
  local_5d8._0_4_ = local_5d8._4_4_;
  fStack_5d0 = (float)local_5d8._4_4_;
  fStack_5cc = (float)local_5d8._4_4_;
  local_348 = (uint)local_128 & (uint)DAT_01fec6c0;
  uStack_344 = (uint)fStack_124 & DAT_01fec6c0._4_4_;
  uStack_340 = (uint)fStack_120 & DAT_01fec6c0._8_4_;
  uStack_33c = (uint)fStack_11c & DAT_01fec6c0._12_4_;
  fVar86 = *(float *)(ray + k * 4 + 0x30);
  local_3a8 = ZEXT416((uint)local_548);
  local_168 = fVar86 - local_548;
  fStack_164 = local_168;
  fStack_160 = local_168;
  fStack_15c = local_168;
  local_430 = uVar74;
  local_358 = uVar80;
  uStack_354 = uVar80;
  uStack_350 = uVar80;
  uStack_34c = uVar80;
  local_368 = uVar81;
  uStack_364 = uVar81;
  uStack_360 = uVar81;
  uStack_35c = uVar81;
  uVar80 = 0;
  bVar78 = 0;
  lVar65 = 1;
  local_560 = (RTCFilterFunctionNArguments *)0x1;
  fVar128 = 0.0;
  fVar130 = 1.0;
  uVar63 = 0;
  uVar244 = 0;
  auVar88 = _DAT_01fec6c0;
  fStack_544 = local_548;
  fStack_540 = local_548;
  fStack_53c = local_548;
  do {
    local_488._4_4_ = fVar130 - fVar128;
    fVar208 = (float)local_488._4_4_ * 0.11111111;
    local_4b8 = fVar128;
    fStack_4b4 = fVar130;
    uStack_4b0 = uVar63;
    uStack_4ac = uVar244;
    local_488._0_4_ = local_488._4_4_;
    fStack_480 = (float)local_488._4_4_;
    fStack_47c = (float)local_488._4_4_;
    local_498 = fVar128;
    fStack_494 = fVar128;
    fStack_490 = fVar128;
    fStack_48c = fVar128;
    fVar293 = (float)local_488._4_4_ * 0.0 + fVar128;
    fVar295 = (float)local_488._4_4_ * 0.33333334 + fVar128;
    fVar298 = (float)local_488._4_4_ * 0.6666667 + fVar128;
    fVar306 = (float)local_488._4_4_ * 1.0 + fVar128;
    fVar235 = 1.0 - fVar293;
    fVar242 = 1.0 - fVar295;
    fVar243 = 1.0 - fVar298;
    fVar245 = 1.0 - fVar306;
    fVar133 = fVar293 * fVar235;
    fVar160 = fVar295 * fVar242;
    fVar161 = fVar298 * fVar243;
    fVar197 = fVar306 * fVar245;
    fVar209 = fVar235 * fVar235 * fVar235;
    fVar233 = fVar242 * fVar242 * fVar242;
    fVar258 = fVar243 * fVar243 * fVar243;
    fVar259 = fVar245 * fVar245 * fVar245;
    fVar324 = fVar293 * fVar293 * fVar293;
    fVar327 = fVar295 * fVar295 * fVar295;
    fVar331 = fVar298 * fVar298 * fVar298;
    fVar339 = fVar306 * fVar306 * fVar306;
    fVar210 = fVar209 * 0.16666667;
    fVar234 = fVar233 * 0.16666667;
    fVar267 = fVar258 * 0.16666667;
    fVar274 = fVar259 * 0.16666667;
    fVar308 = (fVar293 * fVar133 * 6.0 + fVar235 * fVar133 * 12.0 + fVar209 * 4.0 + fVar324) *
              0.16666667;
    fVar310 = (fVar295 * fVar160 * 6.0 + fVar242 * fVar160 * 12.0 + fVar233 * 4.0 + fVar327) *
              0.16666667;
    fVar312 = (fVar298 * fVar161 * 6.0 + fVar243 * fVar161 * 12.0 + fVar258 * 4.0 + fVar331) *
              0.16666667;
    fVar321 = (fVar306 * fVar197 * 6.0 + fVar245 * fVar197 * 12.0 + fVar259 * 4.0 + fVar339) *
              0.16666667;
    fVar209 = (fVar235 * fVar133 * 6.0 + fVar293 * fVar133 * 12.0 + fVar324 * 4.0 + fVar209) *
              0.16666667;
    fVar233 = (fVar242 * fVar160 * 6.0 + fVar295 * fVar160 * 12.0 + fVar327 * 4.0 + fVar233) *
              0.16666667;
    fVar260 = (fVar243 * fVar161 * 6.0 + fVar298 * fVar161 * 12.0 + fVar331 * 4.0 + fVar258) *
              0.16666667;
    fVar266 = (fVar245 * fVar197 * 6.0 + fVar306 * fVar197 * 12.0 + fVar339 * 4.0 + fVar259) *
              0.16666667;
    fVar324 = fVar324 * 0.16666667;
    fVar327 = fVar327 * 0.16666667;
    fVar331 = fVar331 * 0.16666667;
    fVar339 = fVar339 * 0.16666667;
    fVar283 = local_278 * fVar210 + local_2a8 * fVar308 + local_2d8 * fVar209 + local_158 * fVar324;
    fVar294 = fStack_274 * fVar234 +
              fStack_2a4 * fVar310 + fStack_2d4 * fVar233 + fStack_154 * fVar327;
    fVar296 = fStack_270 * fVar267 +
              fStack_2a0 * fVar312 + fStack_2d0 * fVar260 + fStack_150 * fVar331;
    fVar297 = fStack_26c * fVar274 +
              fStack_29c * fVar321 + fStack_2cc * fVar266 + fStack_14c * fVar339;
    fVar345 = local_288 * fVar210 + local_148 * fVar308 + local_2e8 * fVar209 + local_318 * fVar324;
    fVar351 = fStack_284 * fVar234 +
              fStack_144 * fVar310 + fStack_2e4 * fVar233 + fStack_314 * fVar327;
    fVar352 = fStack_280 * fVar267 +
              fStack_140 * fVar312 + fStack_2e0 * fVar260 + fStack_310 * fVar331;
    fVar353 = fStack_27c * fVar274 +
              fStack_13c * fVar321 + fStack_2dc * fVar266 + fStack_30c * fVar339;
    fVar277 = local_138 * fVar210 + local_2b8 * fVar308 + local_2f8 * fVar209 + local_328 * fVar324;
    fVar330 = fStack_134 * fVar234 +
              fStack_2b4 * fVar310 + fStack_2f4 * fVar233 + fStack_324 * fVar327;
    fVar265 = fStack_130 * fVar267 +
              fStack_2b0 * fVar312 + fStack_2f0 * fVar260 + fStack_320 * fVar331;
    fVar282 = fStack_12c * fVar274 +
              fStack_2ac * fVar321 + fStack_2ec * fVar266 + fStack_31c * fVar339;
    fVar258 = fVar210 * local_298 + fVar308 * local_2c8 + fVar209 * local_308 + fVar324 * local_338;
    fVar259 = fVar234 * fStack_294 +
              fVar310 * fStack_2c4 + fVar233 * fStack_304 + fVar327 * fStack_334;
    auVar182._0_8_ = CONCAT44(fVar259,fVar258);
    auVar182._8_4_ =
         fVar267 * fStack_290 + fVar312 * fStack_2c0 + fVar260 * fStack_300 + fVar331 * fStack_330;
    auVar182._12_4_ =
         fVar274 * fStack_28c + fVar321 * fStack_2bc + fVar266 * fStack_2fc + fVar339 * fStack_32c;
    fVar209 = -fVar235 * fVar235 * 0.5;
    fVar210 = -fVar242 * fVar242 * 0.5;
    fVar233 = -fVar243 * fVar243 * 0.5;
    fVar234 = -fVar245 * fVar245 * 0.5;
    fVar267 = (-fVar293 * fVar293 - fVar133 * 4.0) * 0.5;
    fVar274 = (-fVar295 * fVar295 - fVar160 * 4.0) * 0.5;
    fVar260 = (-fVar298 * fVar298 - fVar161 * 4.0) * 0.5;
    fVar266 = (-fVar306 * fVar306 - fVar197 * 4.0) * 0.5;
    fVar133 = (fVar133 * 4.0 + fVar235 * fVar235) * 0.5;
    fVar160 = (fVar160 * 4.0 + fVar242 * fVar242) * 0.5;
    fVar161 = (fVar161 * 4.0 + fVar243 * fVar243) * 0.5;
    fVar197 = (fVar197 * 4.0 + fVar245 * fVar245) * 0.5;
    fVar293 = fVar293 * fVar293 * 0.5;
    fVar235 = fVar295 * fVar295 * 0.5;
    fVar242 = fVar298 * fVar298 * 0.5;
    fVar243 = fVar306 * fVar306 * 0.5;
    local_448 = (local_278 * fVar209 +
                local_2a8 * fVar267 + local_2d8 * fVar133 + local_158 * fVar293) * fVar208;
    fStack_444 = (fStack_274 * fVar210 +
                 fStack_2a4 * fVar274 + fStack_2d4 * fVar160 + fStack_154 * fVar235) * fVar208;
    fStack_440 = (fStack_270 * fVar233 +
                 fStack_2a0 * fVar260 + fStack_2d0 * fVar161 + fStack_150 * fVar242) * fVar208;
    fStack_43c = (fStack_26c * fVar234 +
                 fStack_29c * fVar266 + fStack_2cc * fVar197 + fStack_14c * fVar243) * fVar208;
    fVar340 = (local_288 * fVar209 + local_148 * fVar267 + local_2e8 * fVar133 + local_318 * fVar293
              ) * fVar208;
    fVar275 = (fStack_284 * fVar210 +
              fStack_144 * fVar274 + fStack_2e4 * fVar160 + fStack_314 * fVar235) * fVar208;
    fVar278 = (fStack_280 * fVar233 +
              fStack_140 * fVar260 + fStack_2e0 * fVar161 + fStack_310 * fVar242) * fVar208;
    fVar280 = (fStack_27c * fVar234 +
              fStack_13c * fVar266 + fStack_2dc * fVar197 + fStack_30c * fVar243) * fVar208;
    fVar313 = (local_138 * fVar209 + local_2b8 * fVar267 + local_2f8 * fVar133 + local_328 * fVar293
              ) * fVar208;
    fVar322 = (fStack_134 * fVar210 +
              fStack_2b4 * fVar274 + fStack_2f4 * fVar160 + fStack_324 * fVar235) * fVar208;
    fVar325 = (fStack_130 * fVar233 +
              fStack_2b0 * fVar260 + fStack_2f0 * fVar161 + fStack_320 * fVar242) * fVar208;
    fVar328 = (fStack_12c * fVar234 +
              fStack_2ac * fVar266 + fStack_2ec * fVar197 + fStack_31c * fVar243) * fVar208;
    fVar307 = fVar208 * (fVar210 * fStack_294 +
                        fVar274 * fStack_2c4 + fVar160 * fStack_304 + fVar235 * fStack_334);
    fVar309 = fVar208 * (fVar233 * fStack_290 +
                        fVar260 * fStack_2c0 + fVar161 * fStack_300 + fVar242 * fStack_330);
    fVar311 = fVar208 * (fVar234 * fStack_28c +
                        fVar266 * fStack_2bc + fVar197 * fStack_2fc + fVar243 * fStack_32c);
    auVar145._4_4_ = auVar182._8_4_;
    auVar145._0_4_ = fVar259;
    auVar145._8_4_ = auVar182._12_4_;
    auVar145._12_4_ = 0;
    auVar199._0_8_ = CONCAT44(auVar182._8_4_ - fVar309,fVar259 - fVar307);
    auVar199._8_4_ = auVar182._12_4_ - fVar311;
    auVar199._12_4_ = 0;
    fVar160 = fVar351 - fVar345;
    fVar197 = fVar352 - fVar351;
    fVar210 = fVar353 - fVar352;
    fVar235 = 0.0 - fVar353;
    local_4c8._0_4_ = fVar330 - fVar277;
    local_4c8._4_4_ = fVar265 - fVar330;
    fStack_4c0 = fVar282 - fVar265;
    fStack_4bc = 0.0 - fVar282;
    fVar266 = fVar340 * (float)local_4c8._0_4_ - fVar313 * fVar160;
    fVar295 = fVar275 * (float)local_4c8._4_4_ - fVar322 * fVar197;
    fVar298 = fVar278 * fStack_4c0 - fVar325 * fVar210;
    fVar306 = fVar280 * fStack_4bc - fVar328 * fVar235;
    local_4d8._0_4_ = fVar294 - fVar283;
    local_4d8._4_4_ = fVar296 - fVar294;
    fStack_4d0 = fVar297 - fVar296;
    fStack_4cc = 0.0 - fVar297;
    fVar243 = fVar313 * (float)local_4d8._0_4_ - local_448 * (float)local_4c8._0_4_;
    fVar245 = fVar322 * (float)local_4d8._4_4_ - fStack_444 * (float)local_4c8._4_4_;
    fVar274 = fVar325 * fStack_4d0 - fStack_440 * fStack_4c0;
    fVar260 = fVar328 * fStack_4cc - fStack_43c * fStack_4bc;
    fVar308 = local_448 * fVar160 - fVar340 * (float)local_4d8._0_4_;
    fVar312 = fStack_444 * fVar197 - fVar275 * (float)local_4d8._4_4_;
    fVar324 = fStack_440 * fVar210 - fVar278 * fStack_4d0;
    fVar331 = fStack_43c * fVar235 - fVar280 * fStack_4cc;
    auVar227._0_4_ = fVar160 * fVar160 + (float)local_4c8._0_4_ * (float)local_4c8._0_4_;
    auVar227._4_4_ = fVar197 * fVar197 + (float)local_4c8._4_4_ * (float)local_4c8._4_4_;
    auVar227._8_4_ = fVar210 * fVar210 + fStack_4c0 * fStack_4c0;
    auVar227._12_4_ = fVar235 * fVar235 + fStack_4bc * fStack_4bc;
    auVar261._0_4_ = (float)local_4d8._0_4_ * (float)local_4d8._0_4_ + auVar227._0_4_;
    auVar261._4_4_ = (float)local_4d8._4_4_ * (float)local_4d8._4_4_ + auVar227._4_4_;
    auVar261._8_4_ = fStack_4d0 * fStack_4d0 + auVar227._8_4_;
    auVar261._12_4_ = fStack_4cc * fStack_4cc + auVar227._12_4_;
    auVar164 = rcpps(auVar227,auVar261);
    fVar161 = auVar164._0_4_;
    fVar233 = auVar164._4_4_;
    fVar234 = auVar164._8_4_;
    fVar242 = auVar164._12_4_;
    fVar161 = (1.0 - fVar161 * auVar261._0_4_) * fVar161 + fVar161;
    fVar233 = (1.0 - fVar233 * auVar261._4_4_) * fVar233 + fVar233;
    fVar234 = (1.0 - fVar234 * auVar261._8_4_) * fVar234 + fVar234;
    fVar242 = (1.0 - fVar242 * auVar261._12_4_) * fVar242 + fVar242;
    fVar310 = (float)local_4c8._0_4_ * fVar275 - fVar160 * fVar322;
    fVar321 = (float)local_4c8._4_4_ * fVar278 - fVar197 * fVar325;
    fVar327 = fStack_4c0 * fVar280 - fVar210 * fVar328;
    fVar339 = fStack_4bc * 0.0 - fVar235 * 0.0;
    fVar341 = (float)local_4d8._0_4_ * fVar322 - (float)local_4c8._0_4_ * fStack_444;
    fVar276 = (float)local_4d8._4_4_ * fVar325 - (float)local_4c8._4_4_ * fStack_440;
    fVar279 = fStack_4d0 * fVar328 - fStack_4c0 * fStack_43c;
    fVar281 = fStack_4cc * 0.0 - fStack_4bc * 0.0;
    local_458._4_4_ = fStack_440;
    local_458._0_4_ = fStack_444;
    fStack_450 = fStack_43c;
    fStack_44c = 0.0;
    fVar314 = fVar160 * fStack_444 - (float)local_4d8._0_4_ * fVar275;
    fVar323 = fVar197 * fStack_440 - (float)local_4d8._4_4_ * fVar278;
    fVar326 = fVar210 * fStack_43c - fStack_4d0 * fVar280;
    fVar329 = fVar235 * 0.0 - fStack_4cc * 0.0;
    auVar237._0_4_ = (fVar266 * fVar266 + fVar243 * fVar243 + fVar308 * fVar308) * fVar161;
    auVar237._4_4_ = (fVar295 * fVar295 + fVar245 * fVar245 + fVar312 * fVar312) * fVar233;
    auVar237._8_4_ = (fVar298 * fVar298 + fVar274 * fVar274 + fVar324 * fVar324) * fVar234;
    auVar237._12_4_ = (fVar306 * fVar306 + fVar260 * fVar260 + fVar331 * fVar331) * fVar242;
    auVar251._0_4_ = (fVar310 * fVar310 + fVar341 * fVar341 + fVar314 * fVar314) * fVar161;
    auVar251._4_4_ = (fVar321 * fVar321 + fVar276 * fVar276 + fVar323 * fVar323) * fVar233;
    auVar251._8_4_ = (fVar327 * fVar327 + fVar279 * fVar279 + fVar326 * fVar326) * fVar234;
    auVar251._12_4_ = (fVar339 * fVar339 + fVar281 * fVar281 + fVar329 * fVar329) * fVar242;
    auVar238 = maxps(auVar237,auVar251);
    auVar107._0_4_ =
         fVar208 * (fVar209 * local_298 +
                   fVar267 * local_2c8 + fVar133 * local_308 + fVar293 * local_338) + fVar258;
    auVar107._4_4_ = fVar307 + fVar259;
    auVar107._8_4_ = fVar309 + auVar182._8_4_;
    auVar107._12_4_ = fVar311 + auVar182._12_4_;
    auVar165._8_4_ = auVar182._8_4_;
    auVar165._0_8_ = auVar182._0_8_;
    auVar165._12_4_ = auVar182._12_4_;
    auVar164 = maxps(auVar165,auVar107);
    auVar228._8_4_ = auVar199._8_4_;
    auVar228._0_8_ = auVar199._0_8_;
    auVar228._12_4_ = 0;
    auVar272 = maxps(auVar228,auVar145);
    auVar166 = maxps(auVar164,auVar272);
    auVar164 = minps(auVar182,auVar107);
    auVar272 = minps(auVar199,auVar145);
    auVar183 = minps(auVar164,auVar272);
    auVar164 = sqrtps(auVar145,auVar238);
    auVar272 = rsqrtps(auVar164,auVar261);
    fVar133 = auVar272._0_4_;
    fVar208 = auVar272._4_4_;
    fVar233 = auVar272._8_4_;
    fVar242 = auVar272._12_4_;
    fVar161 = fVar133 * 1.5 - fVar133 * fVar133 * auVar261._0_4_ * 0.5 * fVar133;
    fVar209 = fVar208 * 1.5 - fVar208 * fVar208 * auVar261._4_4_ * 0.5 * fVar208;
    auVar288._4_4_ = fVar209;
    auVar288._0_4_ = fVar161;
    fVar234 = fVar233 * 1.5 - fVar233 * fVar233 * auVar261._8_4_ * 0.5 * fVar233;
    fVar243 = fVar242 * 1.5 - fVar242 * fVar242 * auVar261._12_4_ * 0.5 * fVar242;
    local_468 = 0.0 - fVar345;
    fStack_464 = 0.0 - fVar351;
    fStack_460 = 0.0 - fVar352;
    fStack_45c = 0.0 - fVar353;
    local_478 = 0.0 - fVar277;
    fStack_474 = 0.0 - fVar330;
    fStack_470 = 0.0 - fVar265;
    fStack_46c = 0.0 - fVar282;
    fVar327 = 0.0 - fVar283;
    fVar331 = 0.0 - fVar294;
    fVar339 = 0.0 - fVar296;
    fVar341 = 0.0 - fVar297;
    auVar288._8_4_ = fVar234;
    auVar288._12_4_ = fVar243;
    fVar274 = local_418 * (float)local_4d8._0_4_ * fVar161 +
              fVar175 * fVar160 * fVar161 +
              (float)local_5d8._4_4_ * (float)local_4c8._0_4_ * fVar161;
    fVar260 = fStack_414 * (float)local_4d8._4_4_ * fVar209 +
              fVar175 * fVar197 * fVar209 +
              (float)local_5d8._4_4_ * (float)local_4c8._4_4_ * fVar209;
    fVar266 = fStack_410 * fStack_4d0 * fVar234 +
              fVar175 * fVar210 * fVar234 + (float)local_5d8._4_4_ * fStack_4c0 * fVar234;
    fVar293 = fStack_40c * fStack_4cc * fVar243 +
              fVar175 * fVar235 * fVar243 + (float)local_5d8._4_4_ * fStack_4bc * fVar243;
    local_3b8._0_4_ =
         (float)local_4d8._0_4_ * fVar161 * fVar327 +
         fVar160 * fVar161 * local_468 + (float)local_4c8._0_4_ * fVar161 * local_478;
    local_3b8._4_4_ =
         (float)local_4d8._4_4_ * fVar209 * fVar331 +
         fVar197 * fVar209 * fStack_464 + (float)local_4c8._4_4_ * fVar209 * fStack_474;
    local_3b8._8_4_ =
         fStack_4d0 * fVar234 * fVar339 +
         fVar210 * fVar234 * fStack_460 + fStack_4c0 * fVar234 * fStack_470;
    local_3b8._12_4_ =
         fStack_4cc * fVar243 * fVar341 +
         fVar235 * fVar243 * fStack_45c + fStack_4bc * fVar243 * fStack_46c;
    local_558._0_4_ =
         (local_418 * fVar327 + fVar175 * local_468 + (float)local_5d8._4_4_ * local_478) -
         fVar274 * (float)local_3b8._0_4_;
    local_558._4_4_ =
         (fStack_414 * fVar331 + fVar175 * fStack_464 + (float)local_5d8._4_4_ * fStack_474) -
         fVar260 * (float)local_3b8._4_4_;
    fStack_550 = (fStack_410 * fVar339 + fVar175 * fStack_460 + (float)local_5d8._4_4_ * fStack_470)
                 - fVar266 * (float)local_3b8._8_4_;
    fStack_54c = (fStack_40c * fVar341 + fVar175 * fStack_45c + (float)local_5d8._4_4_ * fStack_46c)
                 - fVar293 * (float)local_3b8._12_4_;
    fVar295 = (fVar327 * fVar327 + local_468 * local_468 + local_478 * local_478) -
              (float)local_3b8._0_4_ * (float)local_3b8._0_4_;
    fVar298 = (fVar331 * fVar331 + fStack_464 * fStack_464 + fStack_474 * fStack_474) -
              (float)local_3b8._4_4_ * (float)local_3b8._4_4_;
    fVar306 = (fVar339 * fVar339 + fStack_460 * fStack_460 + fStack_470 * fStack_470) -
              (float)local_3b8._8_4_ * (float)local_3b8._8_4_;
    fVar308 = (fVar341 * fVar341 + fStack_45c * fStack_45c + fStack_46c * fStack_46c) -
              (float)local_3b8._12_4_ * (float)local_3b8._12_4_;
    fVar133 = (auVar166._0_4_ + auVar164._0_4_) * 1.0000002;
    fVar208 = (auVar166._4_4_ + auVar164._4_4_) * 1.0000002;
    fVar233 = (auVar166._8_4_ + auVar164._8_4_) * 1.0000002;
    fVar242 = (auVar166._12_4_ + auVar164._12_4_) * 1.0000002;
    auVar252._0_4_ = fVar295 - fVar133 * fVar133;
    auVar252._4_4_ = fVar298 - fVar208 * fVar208;
    auVar252._8_4_ = fVar306 - fVar233 * fVar233;
    auVar252._12_4_ = fVar308 - fVar242 * fVar242;
    auVar346._0_4_ = fVar274 * fVar274;
    auVar346._4_4_ = fVar260 * fVar260;
    auVar346._8_4_ = fVar266 * fVar266;
    auVar346._12_4_ = fVar293 * fVar293;
    fVar133 = local_128 - auVar346._0_4_;
    fVar208 = fStack_124 - auVar346._4_4_;
    fVar233 = fStack_120 - auVar346._8_4_;
    fVar242 = fStack_11c - auVar346._12_4_;
    local_558._0_4_ = (float)local_558._0_4_ + (float)local_558._0_4_;
    local_558._4_4_ = (float)local_558._4_4_ + (float)local_558._4_4_;
    fStack_550 = fStack_550 + fStack_550;
    fStack_54c = fStack_54c + fStack_54c;
    fVar245 = (float)local_558._0_4_ * (float)local_558._0_4_;
    fVar258 = (float)local_558._4_4_ * (float)local_558._4_4_;
    fVar259 = fStack_550 * fStack_550;
    fVar267 = fStack_54c * fStack_54c;
    fVar310 = fVar133 * 4.0;
    fVar312 = fVar208 * 4.0;
    fVar321 = fVar233 * 4.0;
    fVar324 = fVar242 * 4.0;
    auVar167._0_4_ = fVar245 - fVar310 * auVar252._0_4_;
    auVar167._4_4_ = fVar258 - fVar312 * auVar252._4_4_;
    auVar167._8_4_ = fVar259 - fVar321 * auVar252._8_4_;
    auVar167._12_4_ = fVar267 - fVar324 * auVar252._12_4_;
    local_4a8 = (auVar183._0_4_ - auVar164._0_4_) * 0.99999976;
    fStack_4a4 = (auVar183._4_4_ - auVar164._4_4_) * 0.99999976;
    fStack_4a0 = (auVar183._8_4_ - auVar164._8_4_) * 0.99999976;
    fStack_49c = (auVar183._12_4_ - auVar164._12_4_) * 0.99999976;
    auVar184._4_4_ = -(uint)(0.0 <= auVar167._4_4_);
    auVar184._0_4_ = -(uint)(0.0 <= auVar167._0_4_);
    auVar184._8_4_ = -(uint)(0.0 <= auVar167._8_4_);
    auVar184._12_4_ = -(uint)(0.0 <= auVar167._12_4_);
    uVar69 = (undefined4)((ulong)lVar65 >> 0x20);
    iVar62 = movmskps((int)lVar65,auVar184);
    if (iVar62 == 0) {
      iVar62 = 0;
      auVar230 = _DAT_01feb9f0;
      auVar254 = _DAT_01feba00;
    }
    else {
      auVar272 = sqrtps(auVar88,auVar167);
      uVar81 = -(uint)(0.0 <= auVar167._0_4_);
      uVar82 = -(uint)(0.0 <= auVar167._4_4_);
      uVar83 = -(uint)(0.0 <= auVar167._8_4_);
      uVar87 = -(uint)(0.0 <= auVar167._12_4_);
      auVar229._0_4_ = fVar133 + fVar133;
      auVar229._4_4_ = fVar208 + fVar208;
      auVar229._8_4_ = fVar233 + fVar233;
      auVar229._12_4_ = fVar242 + fVar242;
      auVar164 = rcpps(auVar252,auVar229);
      fVar276 = auVar164._0_4_;
      fVar281 = auVar164._4_4_;
      fVar309 = auVar164._8_4_;
      fVar314 = auVar164._12_4_;
      fVar276 = (1.0 - auVar229._0_4_ * fVar276) * fVar276 + fVar276;
      fVar281 = (1.0 - auVar229._4_4_ * fVar281) * fVar281 + fVar281;
      fVar309 = (1.0 - auVar229._8_4_ * fVar309) * fVar309 + fVar309;
      fVar314 = (1.0 - auVar229._12_4_ * fVar314) * fVar314 + fVar314;
      fVar279 = (-(float)local_558._0_4_ - auVar272._0_4_) * fVar276;
      fVar307 = (-(float)local_558._4_4_ - auVar272._4_4_) * fVar281;
      fVar311 = (-fStack_550 - auVar272._8_4_) * fVar309;
      fVar323 = (-fStack_54c - auVar272._12_4_) * fVar314;
      fVar276 = (auVar272._0_4_ - (float)local_558._0_4_) * fVar276;
      fVar281 = (auVar272._4_4_ - (float)local_558._4_4_) * fVar281;
      fVar309 = (auVar272._8_4_ - fStack_550) * fVar309;
      fVar314 = (auVar272._12_4_ - fStack_54c) * fVar314;
      local_388[0] = (fVar274 * fVar279 + (float)local_3b8._0_4_) * fVar161;
      local_388[1] = (fVar260 * fVar307 + (float)local_3b8._4_4_) * fVar209;
      local_388[2] = (fVar266 * fVar311 + (float)local_3b8._8_4_) * fVar234;
      local_388[3] = (fVar293 * fVar323 + (float)local_3b8._12_4_) * fVar243;
      local_398[0] = (fVar274 * fVar276 + (float)local_3b8._0_4_) * fVar161;
      local_398[1] = (fVar260 * fVar281 + (float)local_3b8._4_4_) * fVar209;
      local_398[2] = (fVar266 * fVar309 + (float)local_3b8._8_4_) * fVar234;
      local_398[3] = (fVar293 * fVar314 + (float)local_3b8._12_4_) * fVar243;
      auVar253._0_4_ = (uint)fVar279 & uVar81;
      auVar253._4_4_ = (uint)fVar307 & uVar82;
      auVar253._8_4_ = (uint)fVar311 & uVar83;
      auVar253._12_4_ = (uint)fVar323 & uVar87;
      auVar230._0_8_ = CONCAT44(~uVar82,~uVar81) & 0x7f8000007f800000;
      auVar230._8_4_ = ~uVar83 & 0x7f800000;
      auVar230._12_4_ = ~uVar87 & 0x7f800000;
      auVar230 = auVar230 | auVar253;
      auVar342._0_4_ = (uint)fVar276 & uVar81;
      auVar342._4_4_ = (uint)fVar281 & uVar82;
      auVar342._8_4_ = (uint)fVar309 & uVar83;
      auVar342._12_4_ = (uint)fVar314 & uVar87;
      auVar254._0_8_ = CONCAT44(~uVar82,~uVar81) & 0xff800000ff800000;
      auVar254._8_4_ = ~uVar83 & 0xff800000;
      auVar254._12_4_ = ~uVar87 & 0xff800000;
      auVar254 = auVar254 | auVar342;
      auVar262._0_4_ = (uint)auVar346._0_4_ & auVar88._0_4_;
      auVar262._4_4_ = (uint)auVar346._4_4_ & auVar88._4_4_;
      auVar262._8_4_ = (uint)auVar346._8_4_ & auVar88._8_4_;
      auVar262._12_4_ = (uint)auVar346._12_4_ & auVar88._12_4_;
      auVar37._4_4_ = uStack_344;
      auVar37._0_4_ = local_348;
      auVar37._8_4_ = uStack_340;
      auVar37._12_4_ = uStack_33c;
      auVar164 = maxps(auVar37,auVar262);
      fVar309 = auVar164._0_4_ * 1.9073486e-06;
      fVar311 = auVar164._4_4_ * 1.9073486e-06;
      fVar314 = auVar164._8_4_ * 1.9073486e-06;
      fVar323 = auVar164._12_4_ * 1.9073486e-06;
      fVar276 = (float)((uint)fVar133 & auVar88._0_4_);
      fVar279 = (float)((uint)fVar208 & auVar88._4_4_);
      fVar281 = (float)((uint)fVar233 & auVar88._8_4_);
      fVar307 = (float)((uint)fVar242 & auVar88._12_4_);
      auVar343._0_4_ = -(uint)(fVar276 < fVar309 && 0.0 <= auVar167._0_4_);
      auVar343._4_4_ = -(uint)(fVar279 < fVar311 && 0.0 <= auVar167._4_4_);
      auVar343._8_4_ = -(uint)(fVar281 < fVar314 && 0.0 <= auVar167._8_4_);
      auVar343._12_4_ = -(uint)(fVar307 < fVar323 && 0.0 <= auVar167._12_4_);
      iVar62 = movmskps(iVar62,auVar343);
      auVar88 = _DAT_01fec6c0;
      if (iVar62 != 0) {
        auVar264._4_4_ = -(uint)(fVar311 <= fVar279);
        auVar264._0_4_ = -(uint)(fVar309 <= fVar276);
        auVar264._8_4_ = -(uint)(fVar314 <= fVar281);
        auVar264._12_4_ = -(uint)(fVar323 <= fVar307);
        uVar129 = -(uint)(auVar252._0_4_ <= 0.0);
        uVar131 = -(uint)(auVar252._4_4_ <= 0.0);
        uVar132 = -(uint)(auVar252._8_4_ <= 0.0);
        uVar84 = -(uint)(auVar252._12_4_ <= 0.0);
        auVar158._4_4_ = uVar131;
        auVar158._0_4_ = uVar129;
        auVar158._8_4_ = uVar132;
        auVar158._12_4_ = uVar84;
        auVar320._0_4_ = (uVar129 & 0xff800000 | ~uVar129 & 0x7f800000) & auVar343._0_4_;
        auVar320._4_4_ = (uVar131 & 0xff800000 | ~uVar131 & 0x7f800000) & auVar343._4_4_;
        auVar320._8_4_ = (uVar132 & 0xff800000 | ~uVar132 & 0x7f800000) & auVar343._8_4_;
        auVar320._12_4_ = (uVar84 & 0xff800000 | ~uVar84 & 0x7f800000) & auVar343._12_4_;
        auVar305._0_4_ = ~auVar343._0_4_ & auVar230._0_4_;
        auVar305._4_4_ = ~auVar343._4_4_ & auVar230._4_4_;
        auVar305._8_4_ = ~auVar343._8_4_ & auVar230._8_4_;
        auVar305._12_4_ = ~auVar343._12_4_ & auVar230._12_4_;
        auVar230 = auVar305 | auVar320;
        auVar232._0_4_ = (uVar129 & 0x7f800000 | ~uVar129 & 0xff800000) & auVar343._0_4_;
        auVar232._4_4_ = (uVar131 & 0x7f800000 | ~uVar131 & 0xff800000) & auVar343._4_4_;
        auVar232._8_4_ = (uVar132 & 0x7f800000 | ~uVar132 & 0xff800000) & auVar343._8_4_;
        auVar232._12_4_ = (uVar84 & 0x7f800000 | ~uVar84 & 0xff800000) & auVar343._12_4_;
        auVar344._0_4_ = ~auVar343._0_4_ & auVar254._0_4_;
        auVar344._4_4_ = ~auVar343._4_4_ & auVar254._4_4_;
        auVar344._8_4_ = ~auVar343._8_4_ & auVar254._8_4_;
        auVar344._12_4_ = ~auVar343._12_4_ & auVar254._12_4_;
        auVar254 = auVar344 | auVar232;
        auVar158 = auVar158 | auVar264;
        auVar184._4_4_ = auVar158._4_4_ & uVar82;
        auVar184._0_4_ = auVar158._0_4_ & uVar81;
        auVar184._8_4_ = auVar158._8_4_ & uVar83;
        auVar184._12_4_ = auVar158._12_4_ & uVar87;
      }
    }
    auVar185._0_4_ = (auVar184._0_4_ << 0x1f) >> 0x1f;
    auVar185._4_4_ = (auVar184._4_4_ << 0x1f) >> 0x1f;
    auVar185._8_4_ = (auVar184._8_4_ << 0x1f) >> 0x1f;
    auVar185._12_4_ = (auVar184._12_4_ << 0x1f) >> 0x1f;
    auVar185 = auVar185 & local_178;
    iVar62 = movmskps(iVar62,auVar185);
    lVar65 = CONCAT44(uVar69,iVar62);
    fVar276 = local_548;
    fVar279 = fStack_544;
    fVar281 = fStack_540;
    fVar307 = fStack_53c;
    if (iVar62 != 0) {
      local_3c8 = fVar310;
      fStack_3c4 = fVar312;
      fStack_3c0 = fVar321;
      fStack_3bc = fVar324;
      local_1a8 = auVar346;
      local_198 = fVar274;
      fStack_194 = fVar260;
      fStack_190 = fVar266;
      fStack_18c = fVar293;
      local_4e8._4_4_ = fVar258;
      local_4e8._0_4_ = fVar245;
      fStack_4e0 = fVar259;
      fStack_4dc = fVar267;
      local_188 = auVar288;
      local_428._4_4_ = fVar208;
      local_428._0_4_ = fVar133;
      fStack_420 = fVar233;
      fStack_41c = fVar242;
      auVar304._0_4_ = *(float *)(ray + k * 4 + 0x80) - (float)local_3a8._0_4_;
      auVar304._4_4_ = auVar304._0_4_;
      auVar304._8_4_ = auVar304._0_4_;
      auVar304._12_4_ = auVar304._0_4_;
      auVar166 = minps(auVar304,auVar254);
      auVar39._4_4_ = fStack_164;
      auVar39._0_4_ = local_168;
      auVar39._8_4_ = fStack_160;
      auVar39._12_4_ = fStack_15c;
      auVar272 = maxps(auVar39,auVar230);
      auVar108._0_4_ = fVar340 * fVar175 + fVar313 * (float)local_5d8._4_4_;
      auVar108._4_4_ = fVar275 * fVar175 + fVar322 * (float)local_5d8._4_4_;
      auVar108._8_4_ = fVar278 * fVar175 + fVar325 * (float)local_5d8._4_4_;
      auVar108._12_4_ = fVar280 * fVar175 + fVar328 * (float)local_5d8._4_4_;
      auVar332._0_4_ = local_448 * local_418 + auVar108._0_4_;
      auVar332._4_4_ = fStack_444 * fStack_414 + auVar108._4_4_;
      auVar332._8_4_ = fStack_440 * fStack_410 + auVar108._8_4_;
      auVar332._12_4_ = fStack_43c * fStack_40c + auVar108._12_4_;
      auVar164 = rcpps(auVar108,auVar332);
      fVar309 = auVar164._0_4_;
      fVar311 = auVar164._4_4_;
      fVar314 = auVar164._8_4_;
      fVar323 = auVar164._12_4_;
      uVar129 = auVar88._0_4_;
      uVar131 = auVar88._4_4_;
      uVar132 = auVar88._8_4_;
      uVar84 = auVar88._12_4_;
      bVar22 = (float)((uint)auVar332._0_4_ & uVar129) < 1e-18;
      bVar23 = (float)((uint)auVar332._4_4_ & uVar131) < 1e-18;
      bVar24 = (float)((uint)auVar332._8_4_ & uVar132) < 1e-18;
      bVar25 = (float)((uint)auVar332._12_4_ & uVar84) < 1e-18;
      fVar327 = ((1.0 - auVar332._0_4_ * fVar309) * fVar309 + fVar309) *
                -(fVar327 * local_448 + local_468 * fVar340 + local_478 * fVar313);
      fVar331 = ((1.0 - auVar332._4_4_ * fVar311) * fVar311 + fVar311) *
                -(fVar331 * fStack_444 + fStack_464 * fVar275 + fStack_474 * fVar322);
      fVar339 = ((1.0 - auVar332._8_4_ * fVar314) * fVar314 + fVar314) *
                -(fVar339 * fStack_440 + fStack_460 * fVar278 + fStack_470 * fVar325);
      fVar340 = ((1.0 - auVar332._12_4_ * fVar323) * fVar323 + fVar323) *
                -(fVar341 * fStack_43c + fStack_45c * fVar280 + fStack_46c * fVar328);
      uVar81 = -(uint)(auVar332._0_4_ < 0.0 || bVar22);
      uVar82 = -(uint)(auVar332._4_4_ < 0.0 || bVar23);
      uVar83 = -(uint)(auVar332._8_4_ < 0.0 || bVar24);
      uVar87 = -(uint)(auVar332._12_4_ < 0.0 || bVar25);
      auVar231._0_8_ = CONCAT44(uVar82,uVar81) & 0xff800000ff800000;
      auVar231._8_4_ = uVar83 & 0xff800000;
      auVar231._12_4_ = uVar87 & 0xff800000;
      auVar109._0_4_ = ~uVar81 & (uint)fVar327;
      auVar109._4_4_ = ~uVar82 & (uint)fVar331;
      auVar109._8_4_ = ~uVar83 & (uint)fVar339;
      auVar109._12_4_ = ~uVar87 & (uint)fVar340;
      auVar272 = maxps(auVar272,auVar109 | auVar231);
      uVar81 = -(uint)(0.0 < auVar332._0_4_ || bVar22);
      uVar82 = -(uint)(0.0 < auVar332._4_4_ || bVar23);
      uVar83 = -(uint)(0.0 < auVar332._8_4_ || bVar24);
      uVar87 = -(uint)(0.0 < auVar332._12_4_ || bVar25);
      auVar110._0_4_ = (uint)DAT_01feb9f0 & uVar81;
      auVar110._4_4_ = DAT_01feb9f0._4_4_ & uVar82;
      auVar110._8_4_ = DAT_01feb9f0._8_4_ & uVar83;
      auVar110._12_4_ = DAT_01feb9f0._12_4_ & uVar87;
      auVar333._0_4_ = ~uVar81 & (uint)fVar327;
      auVar333._4_4_ = ~uVar82 & (uint)fVar331;
      auVar333._8_4_ = ~uVar83 & (uint)fVar339;
      auVar333._12_4_ = ~uVar87 & (uint)fVar340;
      auVar166 = minps(auVar166,auVar333 | auVar110);
      auVar146._0_4_ = (0.0 - fVar351) * -fVar275 + (0.0 - fVar330) * -fVar322;
      auVar146._4_4_ = (0.0 - fVar352) * -fVar278 + (0.0 - fVar265) * -fVar325;
      auVar146._8_4_ = (0.0 - fVar353) * -fVar280 + (0.0 - fVar282) * -fVar328;
      auVar146._12_4_ = 0x80000000;
      auVar347._0_4_ =
           -fStack_444 * local_418 + -fVar275 * fVar175 + -fVar322 * (float)local_5d8._4_4_;
      auVar347._4_4_ =
           -fStack_440 * fStack_414 + -fVar278 * fVar175 + -fVar325 * (float)local_5d8._4_4_;
      auVar347._8_4_ =
           -fStack_43c * fStack_410 + -fVar280 * fVar175 + -fVar328 * (float)local_5d8._4_4_;
      auVar347._12_4_ = fStack_40c * -0.0 + fVar175 * -0.0 + (float)local_5d8._4_4_ * -0.0;
      auVar164 = rcpps(auVar146,auVar347);
      fVar327 = auVar164._0_4_;
      fVar331 = auVar164._4_4_;
      fVar339 = auVar164._8_4_;
      fVar340 = auVar164._12_4_;
      bVar22 = (float)((uint)auVar347._0_4_ & uVar129) < 1e-18;
      bVar23 = (float)((uint)auVar347._4_4_ & uVar131) < 1e-18;
      bVar24 = (float)((uint)auVar347._8_4_ & uVar132) < 1e-18;
      bVar25 = (float)((uint)auVar347._12_4_ & uVar84) < 1e-18;
      fVar327 = (((float)DAT_01feca10 - auVar347._0_4_ * fVar327) * fVar327 + fVar327) *
                -((0.0 - fVar294) * -fStack_444 + auVar146._0_4_);
      fVar331 = ((DAT_01feca10._4_4_ - auVar347._4_4_ * fVar331) * fVar331 + fVar331) *
                -((0.0 - fVar296) * -fStack_440 + auVar146._4_4_);
      fVar339 = ((DAT_01feca10._8_4_ - auVar347._8_4_ * fVar339) * fVar339 + fVar339) *
                -((0.0 - fVar297) * -fStack_43c + auVar146._8_4_);
      fVar340 = ((DAT_01feca10._12_4_ - auVar347._12_4_ * fVar340) * fVar340 + fVar340) * 0.0;
      uVar81 = -(uint)(auVar347._0_4_ < 0.0 || bVar22);
      uVar82 = -(uint)(auVar347._4_4_ < 0.0 || bVar23);
      uVar83 = -(uint)(auVar347._8_4_ < 0.0 || bVar24);
      uVar87 = -(uint)(auVar347._12_4_ < 0.0 || bVar25);
      auVar147._0_8_ = CONCAT44(uVar82,uVar81) & 0xff800000ff800000;
      auVar147._8_4_ = uVar83 & 0xff800000;
      auVar147._12_4_ = uVar87 & 0xff800000;
      auVar111._0_4_ = ~uVar81 & (uint)fVar327;
      auVar111._4_4_ = ~uVar82 & (uint)fVar331;
      auVar111._8_4_ = ~uVar83 & (uint)fVar339;
      auVar111._12_4_ = ~uVar87 & (uint)fVar340;
      auVar164 = maxps(auVar272,auVar111 | auVar147);
      uVar81 = -(uint)(0.0 < auVar347._0_4_ || bVar22);
      uVar82 = -(uint)(0.0 < auVar347._4_4_ || bVar23);
      uVar83 = -(uint)(0.0 < auVar347._8_4_ || bVar24);
      uVar87 = -(uint)(0.0 < auVar347._12_4_ || bVar25);
      auVar112._0_4_ = (uint)DAT_01feb9f0 & uVar81;
      auVar112._4_4_ = DAT_01feb9f0._4_4_ & uVar82;
      auVar112._8_4_ = DAT_01feb9f0._8_4_ & uVar83;
      auVar112._12_4_ = DAT_01feb9f0._12_4_ & uVar87;
      auVar348._0_4_ = ~uVar81 & (uint)fVar327;
      auVar348._4_4_ = ~uVar82 & (uint)fVar331;
      auVar348._8_4_ = ~uVar83 & (uint)fVar339;
      auVar348._12_4_ = ~uVar87 & (uint)fVar340;
      auVar272 = minps(auVar166,auVar348 | auVar112);
      fVar327 = auVar164._12_4_;
      fVar331 = auVar164._0_4_;
      fVar339 = auVar164._4_4_;
      fVar340 = auVar164._8_4_;
      auVar334._0_4_ = -(uint)(fVar331 <= auVar272._0_4_) & auVar185._0_4_;
      auVar334._4_4_ = -(uint)(fVar339 <= auVar272._4_4_) & auVar185._4_4_;
      auVar334._8_4_ = -(uint)(fVar340 <= auVar272._8_4_) & auVar185._8_4_;
      auVar334._12_4_ = -(uint)(fVar327 <= auVar272._12_4_) & auVar185._12_4_;
      iVar62 = movmskps(iVar62,auVar334);
      lVar65 = CONCAT44(uVar69,iVar62);
      if (iVar62 != 0) {
        auVar33._4_4_ = fStack_4a4;
        auVar33._0_4_ = local_4a8;
        auVar33._8_4_ = fStack_4a0;
        auVar33._12_4_ = fStack_49c;
        auVar166 = maxps(ZEXT816(0),auVar33);
        auVar36._4_4_ = local_388[1];
        auVar36._0_4_ = local_388[0];
        auVar36._8_4_ = local_388[2];
        auVar36._12_4_ = local_388[3];
        auVar183 = minps(auVar36,_DAT_01feca10);
        auVar183 = maxps(auVar183,ZEXT816(0));
        auVar35._4_4_ = local_398[1];
        auVar35._0_4_ = local_398[0];
        auVar35._8_4_ = local_398[2];
        auVar35._12_4_ = local_398[3];
        auVar238 = minps(auVar35,_DAT_01feca10);
        auVar238 = maxps(auVar238,ZEXT816(0));
        local_388[0] = (auVar183._0_4_ + (float)DAT_01ff1e00) * 0.25 * (float)local_488._4_4_ +
                       fVar128;
        local_388[1] = (auVar183._4_4_ + DAT_01ff1e00._4_4_) * 0.25 * (float)local_488._4_4_ +
                       fVar128;
        local_388[2] = (auVar183._8_4_ + DAT_01ff1e00._8_4_) * 0.25 * (float)local_488._4_4_ +
                       fVar128;
        local_388[3] = (auVar183._12_4_ + DAT_01ff1e00._12_4_) * 0.25 * (float)local_488._4_4_ +
                       fVar128;
        fVar341 = 0.0;
        fVar275 = 0.0;
        fVar278 = 0.0;
        fVar280 = 0.0;
        local_398[0] = (auVar238._0_4_ + (float)DAT_01ff1e00) * 0.25 * (float)local_488._4_4_ +
                       fVar128;
        local_398[1] = (auVar238._4_4_ + DAT_01ff1e00._4_4_) * 0.25 * (float)local_488._4_4_ +
                       fVar128;
        local_398[2] = (auVar238._8_4_ + DAT_01ff1e00._8_4_) * 0.25 * (float)local_488._4_4_ +
                       fVar128;
        local_398[3] = (auVar238._12_4_ + DAT_01ff1e00._12_4_) * 0.25 * (float)local_488._4_4_ +
                       fVar128;
        auVar168._0_4_ = fVar295 - auVar166._0_4_ * auVar166._0_4_;
        auVar168._4_4_ = fVar298 - auVar166._4_4_ * auVar166._4_4_;
        auVar168._8_4_ = fVar306 - auVar166._8_4_ * auVar166._8_4_;
        auVar168._12_4_ = fVar308 - auVar166._12_4_ * auVar166._12_4_;
        auVar200._0_4_ = fVar245 - fVar310 * auVar168._0_4_;
        auVar200._4_4_ = fVar258 - fVar312 * auVar168._4_4_;
        auVar200._8_4_ = fVar259 - fVar321 * auVar168._8_4_;
        auVar200._12_4_ = fVar267 - fVar324 * auVar168._12_4_;
        local_4e8._4_4_ = -(uint)(0.0 <= auVar200._4_4_);
        local_4e8._0_4_ = -(uint)(0.0 <= auVar200._0_4_);
        fStack_4e0 = (float)-(uint)(0.0 <= auVar200._8_4_);
        fStack_4dc = (float)-(uint)(0.0 <= auVar200._12_4_);
        iVar62 = movmskps(iVar62,_local_4e8);
        if (iVar62 == 0) {
          fVar160 = 0.0;
          fVar197 = 0.0;
          fVar210 = 0.0;
          fVar235 = 0.0;
          fVar161 = 0.0;
          fVar209 = 0.0;
          fVar234 = 0.0;
          fVar243 = 0.0;
          fVar258 = 0.0;
          fVar267 = 0.0;
          fVar298 = 0.0;
          fVar308 = 0.0;
          fVar245 = 0.0;
          fVar259 = 0.0;
          fVar295 = 0.0;
          fVar306 = 0.0;
          _local_558 = ZEXT816(0);
          iVar62 = 0;
          auVar256 = _DAT_01feba00;
          auVar263 = _DAT_01feb9f0;
        }
        else {
          auVar183 = sqrtps(_DAT_01ff1e00,auVar200);
          auVar148._0_4_ = fVar133 + fVar133;
          auVar148._4_4_ = fVar208 + fVar208;
          auVar148._8_4_ = fVar233 + fVar233;
          auVar148._12_4_ = fVar242 + fVar242;
          auVar166 = rcpps(auVar168,auVar148);
          fVar310 = auVar166._0_4_;
          fVar312 = auVar166._4_4_;
          fVar321 = auVar166._8_4_;
          fVar324 = auVar166._12_4_;
          fVar310 = ((float)DAT_01feca10 - auVar148._0_4_ * fVar310) * fVar310 + fVar310;
          fVar312 = (DAT_01feca10._4_4_ - auVar148._4_4_ * fVar312) * fVar312 + fVar312;
          fVar321 = (DAT_01feca10._8_4_ - auVar148._8_4_ * fVar321) * fVar321 + fVar321;
          fVar324 = (DAT_01feca10._12_4_ - auVar148._12_4_ * fVar324) * fVar324 + fVar324;
          fVar309 = (-(float)local_558._0_4_ - auVar183._0_4_) * fVar310;
          fVar311 = (-(float)local_558._4_4_ - auVar183._4_4_) * fVar312;
          fVar313 = (-fStack_550 - auVar183._8_4_) * fVar321;
          fVar314 = (-fStack_54c - auVar183._12_4_) * fVar324;
          fVar310 = (auVar183._0_4_ - (float)local_558._0_4_) * fVar310;
          fVar312 = (auVar183._4_4_ - (float)local_558._4_4_) * fVar312;
          fVar321 = (auVar183._8_4_ - fStack_550) * fVar321;
          fVar324 = (auVar183._12_4_ - fStack_54c) * fVar324;
          fVar341 = (fVar274 * fVar309 + (float)local_3b8._0_4_) * fVar161;
          fVar275 = (fVar260 * fVar311 + (float)local_3b8._4_4_) * fVar209;
          fVar278 = (fVar266 * fVar313 + (float)local_3b8._8_4_) * fVar234;
          fVar280 = (fVar293 * fVar314 + (float)local_3b8._12_4_) * fVar243;
          fVar258 = local_418 * fVar309 - ((float)local_4d8._0_4_ * fVar341 + fVar283);
          fVar267 = fStack_414 * fVar311 - ((float)local_4d8._4_4_ * fVar275 + fVar294);
          fVar298 = fStack_410 * fVar313 - (fStack_4d0 * fVar278 + fVar296);
          fVar308 = fStack_40c * fVar314 - (fStack_4cc * fVar280 + fVar297);
          fVar245 = fVar175 * fVar309 - (fVar160 * fVar341 + fVar345);
          fVar259 = fVar175 * fVar311 - (fVar197 * fVar275 + fVar351);
          fVar295 = fVar175 * fVar313 - (fVar210 * fVar278 + fVar352);
          fVar306 = fVar175 * fVar314 - (fVar235 * fVar280 + fVar353);
          local_558._4_4_ =
               (float)local_5d8._4_4_ * fVar311 - (fVar275 * (float)local_4c8._4_4_ + fVar330);
          local_558._0_4_ =
               (float)local_5d8._4_4_ * fVar309 - (fVar341 * (float)local_4c8._0_4_ + fVar277);
          fStack_550 = (float)local_5d8._4_4_ * fVar313 - (fVar278 * fStack_4c0 + fVar265);
          fStack_54c = (float)local_5d8._4_4_ * fVar314 - (fVar280 * fStack_4bc + fVar282);
          fVar161 = (fVar274 * fVar310 + (float)local_3b8._0_4_) * fVar161;
          fVar209 = (fVar260 * fVar312 + (float)local_3b8._4_4_) * fVar209;
          fVar234 = (fVar266 * fVar321 + (float)local_3b8._8_4_) * fVar234;
          fVar243 = (fVar293 * fVar324 + (float)local_3b8._12_4_) * fVar243;
          fVar341 = local_418 * fVar310 - ((float)local_4d8._0_4_ * fVar161 + fVar283);
          fVar275 = fStack_414 * fVar312 - ((float)local_4d8._4_4_ * fVar209 + fVar294);
          fVar278 = fStack_410 * fVar321 - (fStack_4d0 * fVar234 + fVar296);
          fVar280 = fStack_40c * fVar324 - (fStack_4cc * fVar243 + fVar297);
          fVar160 = fVar175 * fVar310 - (fVar160 * fVar161 + fVar345);
          fVar197 = fVar175 * fVar312 - (fVar197 * fVar209 + fVar351);
          fVar210 = fVar175 * fVar321 - (fVar210 * fVar234 + fVar352);
          fVar235 = fVar175 * fVar324 - (fVar235 * fVar243 + fVar353);
          bVar22 = 0.0 <= auVar200._0_4_;
          uVar81 = -(uint)bVar22;
          bVar23 = 0.0 <= auVar200._4_4_;
          uVar82 = -(uint)bVar23;
          bVar24 = 0.0 <= auVar200._8_4_;
          uVar83 = -(uint)bVar24;
          bVar25 = 0.0 <= auVar200._12_4_;
          uVar87 = -(uint)bVar25;
          fVar161 = (float)local_5d8._4_4_ * fVar310 - (fVar161 * (float)local_4c8._0_4_ + fVar277);
          fVar209 = (float)local_5d8._4_4_ * fVar312 - (fVar209 * (float)local_4c8._4_4_ + fVar330);
          fVar234 = (float)local_5d8._4_4_ * fVar321 - (fVar234 * fStack_4c0 + fVar265);
          fVar243 = (float)local_5d8._4_4_ * fVar324 - (fVar243 * fStack_4bc + fVar282);
          auVar255._0_4_ = (uint)fVar309 & uVar81;
          auVar255._4_4_ = (uint)fVar311 & uVar82;
          auVar255._8_4_ = (uint)fVar313 & uVar83;
          auVar255._12_4_ = (uint)fVar314 & uVar87;
          auVar263._0_8_ = CONCAT44(~uVar82,~uVar81) & 0x7f8000007f800000;
          auVar263._8_4_ = ~uVar83 & 0x7f800000;
          auVar263._12_4_ = ~uVar87 & 0x7f800000;
          auVar263 = auVar263 | auVar255;
          auVar239._0_4_ = (uint)fVar310 & uVar81;
          auVar239._4_4_ = (uint)fVar312 & uVar82;
          auVar239._8_4_ = (uint)fVar321 & uVar83;
          auVar239._12_4_ = (uint)fVar324 & uVar87;
          auVar256._0_8_ = CONCAT44(~uVar82,~uVar81) & 0xff800000ff800000;
          auVar256._8_4_ = ~uVar83 & 0xff800000;
          auVar256._12_4_ = ~uVar87 & 0xff800000;
          auVar256 = auVar256 | auVar239;
          auVar113._0_4_ = (uint)auVar346._0_4_ & uVar129;
          auVar113._4_4_ = (uint)auVar346._4_4_ & uVar131;
          auVar113._8_4_ = (uint)auVar346._8_4_ & uVar132;
          auVar113._12_4_ = (uint)auVar346._12_4_ & uVar84;
          auVar38._4_4_ = uStack_344;
          auVar38._0_4_ = local_348;
          auVar38._8_4_ = uStack_340;
          auVar38._12_4_ = uStack_33c;
          auVar166 = maxps(auVar38,auVar113);
          fVar274 = auVar166._0_4_ * 1.9073486e-06;
          fVar277 = auVar166._4_4_ * 1.9073486e-06;
          fVar330 = auVar166._8_4_ * 1.9073486e-06;
          fVar260 = auVar166._12_4_ * 1.9073486e-06;
          auVar240._0_4_ = -(uint)((float)((uint)fVar133 & uVar129) < fVar274 && bVar22);
          auVar240._4_4_ = -(uint)((float)((uint)fVar208 & uVar131) < fVar277 && bVar23);
          auVar240._8_4_ = -(uint)((float)((uint)fVar233 & uVar132) < fVar330 && bVar24);
          auVar240._12_4_ = -(uint)((float)((uint)fVar242 & uVar84) < fVar260 && bVar25);
          iVar62 = movmskps(iVar62,auVar240);
          if (iVar62 != 0) {
            uVar81 = -(uint)(auVar168._0_4_ <= 0.0);
            uVar82 = -(uint)(auVar168._4_4_ <= 0.0);
            uVar83 = -(uint)(auVar168._8_4_ <= 0.0);
            uVar87 = -(uint)(auVar168._12_4_ <= 0.0);
            auVar291._0_4_ = (uVar81 & 0xff800000 | ~uVar81 & 0x7f800000) & auVar240._0_4_;
            auVar291._4_4_ = (uVar82 & 0xff800000 | ~uVar82 & 0x7f800000) & auVar240._4_4_;
            auVar291._8_4_ = (uVar83 & 0xff800000 | ~uVar83 & 0x7f800000) & auVar240._8_4_;
            auVar291._12_4_ = (uVar87 & 0xff800000 | ~uVar87 & 0x7f800000) & auVar240._12_4_;
            auVar273._0_4_ = ~auVar240._0_4_ & auVar263._0_4_;
            auVar273._4_4_ = ~auVar240._4_4_ & auVar263._4_4_;
            auVar273._8_4_ = ~auVar240._8_4_ & auVar263._8_4_;
            auVar273._12_4_ = ~auVar240._12_4_ & auVar263._12_4_;
            auVar263 = auVar273 | auVar291;
            auVar292._0_4_ = (uVar81 & 0x7f800000 | ~uVar81 & 0xff800000) & auVar240._0_4_;
            auVar292._4_4_ = (uVar82 & 0x7f800000 | ~uVar82 & 0xff800000) & auVar240._4_4_;
            auVar292._8_4_ = (uVar83 & 0x7f800000 | ~uVar83 & 0xff800000) & auVar240._8_4_;
            auVar292._12_4_ = (uVar87 & 0x7f800000 | ~uVar87 & 0xff800000) & auVar240._12_4_;
            auVar241._0_4_ = ~auVar240._0_4_ & auVar256._0_4_;
            auVar241._4_4_ = ~auVar240._4_4_ & auVar256._4_4_;
            auVar241._8_4_ = ~auVar240._8_4_ & auVar256._8_4_;
            auVar241._12_4_ = ~auVar240._12_4_ & auVar256._12_4_;
            auVar256 = auVar241 | auVar292;
            local_4e8._4_4_ =
                 -(uint)((fVar277 <= (float)((uint)fVar208 & uVar131) || auVar168._4_4_ <= 0.0) &&
                        bVar23);
            local_4e8._0_4_ =
                 -(uint)((fVar274 <= (float)((uint)fVar133 & uVar129) || auVar168._0_4_ <= 0.0) &&
                        bVar22);
            fStack_4e0 = (float)-(uint)((fVar330 <= (float)((uint)fVar233 & uVar132) ||
                                        auVar168._8_4_ <= 0.0) && bVar24);
            fStack_4dc = (float)-(uint)((fVar260 <= (float)((uint)fVar242 & uVar84) ||
                                        auVar168._12_4_ <= 0.0) && bVar25);
          }
        }
        local_4c8._4_4_ =
             -(uint)(0.3 <= (float)((uint)(fVar275 * fStack_414 +
                                          fVar197 * fVar175 + fVar209 * (float)local_5d8._4_4_) &
                                   uVar131));
        local_4c8._0_4_ =
             -(uint)(0.3 <= (float)((uint)(fVar341 * local_418 +
                                          fVar160 * fVar175 + fVar161 * (float)local_5d8._4_4_) &
                                   uVar129));
        fStack_4c0 = (float)-(uint)(0.3 <= (float)((uint)(fVar278 * fStack_410 +
                                                         fVar210 * fVar175 +
                                                         fVar234 * (float)local_5d8._4_4_) & uVar132
                                                  ));
        fStack_4bc = (float)-(uint)(0.3 <= (float)((uint)(fVar280 * fStack_40c +
                                                         fVar235 * fVar175 +
                                                         fVar243 * (float)local_5d8._4_4_) & uVar84)
                                   );
        _local_118 = auVar164;
        local_108 = minps(auVar272,auVar263);
        _local_1d8 = maxps(auVar164,auVar256);
        local_1c8 = auVar272;
        auVar257._0_4_ = -(uint)(fVar331 <= local_108._0_4_) & auVar334._0_4_;
        auVar257._4_4_ = -(uint)(fVar339 <= local_108._4_4_) & auVar334._4_4_;
        auVar257._8_4_ = -(uint)(fVar340 <= local_108._8_4_) & auVar334._8_4_;
        auVar257._12_4_ = -(uint)(fVar327 <= local_108._12_4_) & auVar334._12_4_;
        local_3d8 = auVar257;
        local_3e8._0_8_ =
             CONCAT44(-(uint)(local_1d8._4_4_ <= auVar272._4_4_) & auVar334._4_4_,
                      -(uint)(local_1d8._0_4_ <= auVar272._0_4_) & auVar334._0_4_);
        local_3e8._8_4_ = -(uint)(local_1d8._8_4_ <= auVar272._8_4_) & auVar334._8_4_;
        local_3e8._12_4_ = -(uint)(local_1d8._12_4_ <= auVar272._12_4_) & auVar334._12_4_;
        auVar114._8_4_ = local_3e8._8_4_;
        auVar114._0_8_ = local_3e8._0_8_;
        auVar114._12_4_ = local_3e8._12_4_;
        iVar62 = movmskps(iVar62,auVar114 | auVar257);
        lVar65 = CONCAT44(uVar69,iVar62);
        if (iVar62 != 0) {
          _local_428 = local_3e8;
          _local_4d8 = _local_1d8;
          local_3c8 = local_560._0_4_;
          fStack_3c4 = local_560._0_4_;
          fStack_3c0 = local_560._0_4_;
          fStack_3bc = local_560._0_4_;
          local_558._0_4_ =
               -(uint)((int)local_560._0_4_ <
                      ((int)((-(uint)(0.3 <= (float)((uint)((float)local_558._0_4_ *
                                                            (float)local_5d8._4_4_ +
                                                            fVar245 * fVar175 + fVar258 * local_418)
                                                    & uVar129)) & local_4e8._0_4_) << 0x1f) >> 0x1f)
                      + 4);
          local_558._4_4_ =
               -(uint)((int)local_560._0_4_ <
                      ((int)((-(uint)(0.3 <= (float)((uint)((float)local_558._4_4_ *
                                                            (float)local_5d8._4_4_ +
                                                            fVar259 * fVar175 + fVar267 * fStack_414
                                                           ) & uVar131)) & local_4e8._4_4_) << 0x1f)
                      >> 0x1f) + 4);
          fStack_550 = (float)-(uint)((int)local_560._0_4_ <
                                     ((int)((-(uint)(0.3 <= (float)((uint)(fStack_550 *
                                                                           (float)local_5d8._4_4_ +
                                                                           fVar295 * fVar175 +
                                                                          fVar298 * fStack_410) &
                                                                   uVar132)) & (uint)fStack_4e0) <<
                                           0x1f) >> 0x1f) + 4);
          fStack_54c = (float)-(uint)((int)local_560._0_4_ <
                                     ((int)((-(uint)(0.3 <= (float)((uint)(fStack_54c *
                                                                           (float)local_5d8._4_4_ +
                                                                           fVar306 * fVar175 +
                                                                          fVar308 * fStack_40c) &
                                                                   uVar84)) & (uint)fStack_4dc) <<
                                           0x1f) >> 0x1f) + 4);
          local_3d8 = ~_local_558 & auVar257;
          iVar62 = movmskps(iVar62,local_3d8);
          local_3b8 = auVar257;
          auVar290 = _local_5d8;
          if (iVar62 != 0) {
            local_4a8 = local_548 + fVar331;
            fStack_4a4 = fStack_544 + fVar339;
            fStack_4a0 = fStack_540 + fVar340;
            fStack_49c = fStack_53c + fVar327;
            do {
              auVar166 = ~local_3d8 & _DAT_01feb9f0 | local_3d8 & auVar164;
              auVar186._4_4_ = auVar166._0_4_;
              auVar186._0_4_ = auVar166._4_4_;
              auVar186._8_4_ = auVar166._12_4_;
              auVar186._12_4_ = auVar166._8_4_;
              auVar272 = minps(auVar186,auVar166);
              auVar149._0_8_ = auVar272._8_8_;
              auVar149._8_4_ = auVar272._0_4_;
              auVar149._12_4_ = auVar272._4_4_;
              auVar272 = minps(auVar149,auVar272);
              auVar150._0_8_ =
                   CONCAT44(-(uint)(auVar272._4_4_ == auVar166._4_4_) & local_3d8._4_4_,
                            -(uint)(auVar272._0_4_ == auVar166._0_4_) & local_3d8._0_4_);
              auVar150._8_4_ = -(uint)(auVar272._8_4_ == auVar166._8_4_) & local_3d8._8_4_;
              auVar150._12_4_ = -(uint)(auVar272._12_4_ == auVar166._12_4_) & local_3d8._12_4_;
              iVar62 = movmskps(iVar62,auVar150);
              auVar115 = local_3d8;
              if (iVar62 != 0) {
                auVar115._8_4_ = auVar150._8_4_;
                auVar115._0_8_ = auVar150._0_8_;
                auVar115._12_4_ = auVar150._12_4_;
              }
              uVar63 = movmskps(iVar62,auVar115);
              lVar65 = 0;
              if (CONCAT44(uVar69,uVar63) != 0) {
                for (; (CONCAT44(uVar69,uVar63) >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
                }
              }
              *(undefined4 *)(local_3d8 + lVar65 * 4) = 0;
              fVar128 = local_388[lVar65];
              fVar130 = *(float *)(local_118 + lVar65 * 4);
              fVar133 = SQRT(fVar196);
              if ((float)local_408._0_4_ < 0.0) {
                fVar133 = sqrtf((float)local_408._0_4_);
                lVar65 = extraout_RAX;
                auVar88 = _DAT_01fec6c0;
              }
              auVar27._4_4_ = fVar174;
              auVar27._0_4_ = fVar162;
              auVar27._8_4_ = fVar176;
              auVar27._12_4_ = fVar195;
              auVar31._4_4_ = fStack_524;
              auVar31._0_4_ = local_528;
              auVar31._8_4_ = fStack_520;
              auVar31._12_4_ = fStack_51c;
              auVar166 = minps(auVar27,auVar31);
              auVar183 = maxps(auVar27,auVar31);
              auVar29._4_4_ = fStack_534;
              auVar29._0_4_ = local_538;
              auVar29._8_4_ = fStack_530;
              auVar29._12_4_ = fStack_52c;
              auVar272 = minps(auVar29,_local_608);
              auVar166 = minps(auVar166,auVar272);
              auVar272 = maxps(auVar29,_local_608);
              auVar272 = maxps(auVar183,auVar272);
              auVar201._0_4_ = auVar166._0_4_ & auVar88._0_4_;
              auVar201._4_4_ = auVar166._4_4_ & auVar88._4_4_;
              auVar201._8_4_ = auVar166._8_4_ & auVar88._8_4_;
              auVar201._12_4_ = auVar166._12_4_ & auVar88._12_4_;
              local_498 = auVar272._12_4_;
              auVar116._0_4_ = auVar272._0_4_ & auVar88._0_4_;
              auVar116._4_4_ = auVar272._4_4_ & auVar88._4_4_;
              auVar116._8_4_ = auVar272._8_4_ & auVar88._8_4_;
              auVar116._12_4_ = (uint)local_498 & auVar88._12_4_;
              auVar88 = maxps(auVar201,auVar116);
              fVar160 = auVar88._4_4_;
              if (auVar88._4_4_ <= auVar88._0_4_) {
                fVar160 = auVar88._0_4_;
              }
              auVar202._8_8_ = auVar88._8_8_;
              auVar202._0_8_ = auVar88._8_8_;
              if (auVar88._8_4_ <= fVar160) {
                auVar202._0_4_ = fVar160;
              }
              fVar160 = auVar202._0_4_ * 1.9073486e-06;
              local_468 = fVar133 * 1.9073486e-06;
              fStack_494 = local_498;
              fStack_490 = local_498;
              fStack_48c = local_498;
              lVar79 = 5;
              do {
                fVar245 = 1.0 - fVar128;
                fVar243 = fVar128 * fVar245;
                fVar208 = fVar245 * fVar245 * fVar245;
                fVar133 = fVar128 * fVar128 * fVar128;
                fVar197 = (fVar243 * fVar128 * 12.0 + fVar245 * fVar243 * 6.0 +
                          fVar133 * 4.0 + fVar208) * 0.16666667;
                fVar161 = fVar133 * 0.16666667;
                fVar209 = fVar208 * 0.16666667;
                fVar133 = (fVar245 * fVar243 * 12.0 + fVar243 * fVar128 * 6.0 +
                          fVar208 * 4.0 + fVar133) * 0.16666667;
                fVar242 = fVar209 * fVar195 +
                          fVar133 * fStack_51c + fVar197 * fStack_52c + fVar161 * fStack_5fc;
                fVar208 = (fVar130 * (float)local_3f8._0_4_ + 0.0) -
                          (fVar209 * fVar162 +
                          fVar133 * local_528 +
                          fVar197 * local_538 + fVar161 * (float)local_608._0_4_);
                fVar210 = (fVar130 * (float)local_3f8._4_4_ + 0.0) -
                          (fVar209 * fVar174 +
                          fVar133 * fStack_524 +
                          fVar197 * fStack_534 + fVar161 * (float)local_608._4_4_);
                fVar234 = (fVar130 * fStack_3f0 + 0.0) -
                          (fVar209 * fVar176 +
                          fVar133 * fStack_520 + fVar197 * fStack_530 + fVar161 * fStack_600);
                fVar235 = (fVar130 * fStack_3ec + 0.0) - fVar242;
                fVar133 = fVar210 * fVar210;
                fVar161 = fVar234 * fVar234;
                fVar197 = fVar235 * fVar235;
                fVar209 = fVar133 + fVar208 * fVar208 + fVar161;
                fVar233 = fVar133 + fVar133 + fVar197;
                fVar161 = fVar133 + fVar161 + fVar161;
                fVar197 = fVar133 + fVar197 + fVar197;
                local_478 = fVar209;
                if (fVar209 < 0.0) {
                  fVar133 = sqrtf(fVar209);
                  lVar65 = extraout_RAX_00;
                }
                else {
                  fVar133 = SQRT(fVar209);
                }
                fVar259 = -fVar245 * fVar245 * 0.5;
                fVar258 = (-fVar128 * fVar128 - fVar243 * 4.0) * 0.5;
                fVar243 = (fVar245 * fVar245 + fVar243 * 4.0) * 0.5;
                fVar330 = fVar128 * fVar128 * 0.5;
                fVar267 = fVar259 * fVar162 +
                          fVar258 * local_528 +
                          fVar243 * local_538 + fVar330 * (float)local_608._0_4_;
                fVar274 = fVar259 * fVar174 +
                          fVar258 * fStack_524 +
                          fVar243 * fStack_534 + fVar330 * (float)local_608._4_4_;
                fVar277 = fVar259 * fVar176 +
                          fVar258 * fStack_520 + fVar243 * fStack_530 + fVar330 * fStack_600;
                fVar258 = fVar259 * fVar195 +
                          fVar258 * fStack_51c + fVar243 * fStack_52c + fVar330 * fStack_5fc;
                fVar243 = fVar128 - (fVar245 + fVar245);
                fVar259 = fVar245 - (fVar128 + fVar128);
                fVar330 = fVar245 * fVar162 +
                          fVar243 * local_528 +
                          fVar259 * local_538 + fVar128 * (float)local_608._0_4_;
                fVar260 = fVar245 * fVar174 +
                          fVar243 * fStack_524 +
                          fVar259 * fStack_534 + fVar128 * (float)local_608._4_4_;
                fVar245 = fVar245 * fVar176 +
                          fVar243 * fStack_520 + fVar259 * fStack_530 + fVar128 * fStack_600;
                fVar243 = fVar160;
                if (fVar160 <= local_468 * fVar130) {
                  fVar243 = local_468 * fVar130;
                }
                fVar259 = fVar274 * fVar274 + fVar267 * fVar267 + fVar277 * fVar277;
                auVar272 = ZEXT416((uint)fVar259);
                auVar88 = rsqrtss(ZEXT416((uint)fVar259),auVar272);
                fVar265 = auVar88._0_4_;
                fVar265 = fVar265 * fVar265 * fVar259 * -0.5 * fVar265 + fVar265 * 1.5;
                fVar266 = fVar245 * fVar277 + fVar260 * fVar274 + fVar330 * fVar267;
                auVar88 = rcpss(auVar272,auVar272);
                fVar282 = (2.0 - fVar259 * auVar88._0_4_) * auVar88._0_4_;
                fVar293 = fVar267 * fVar265;
                fVar295 = fVar274 * fVar265;
                fVar298 = fVar277 * fVar265;
                fVar306 = fVar258 * fVar265;
                if (fVar259 < 0.0) {
                  fVar308 = sqrtf(fVar259);
                  lVar65 = extraout_RAX_01;
                }
                else {
                  fVar308 = SQRT(fVar259);
                }
                fVar310 = fVar210 * fVar295;
                fVar312 = fVar234 * fVar298;
                fVar321 = fVar235 * fVar306;
                fVar324 = fVar310 + fVar208 * fVar293 + fVar312;
                fVar327 = fVar310 + fVar310 + fVar321;
                fVar312 = fVar310 + fVar312 + fVar312;
                fVar321 = fVar310 + fVar321 + fVar321;
                fVar310 = (fVar133 + 1.0) * (fVar160 / fVar308) + fVar133 * fVar160 + fVar243;
                fVar308 = fStack_3ec * fVar306;
                fVar330 = fVar298 * -fVar277 + fVar295 * -fVar274 + fVar293 * -fVar267 +
                          fVar282 * (fVar259 * fVar245 - fVar266 * fVar277) * fVar265 * fVar234 +
                          fVar282 * (fVar259 * fVar260 - fVar266 * fVar274) * fVar265 * fVar210 +
                          fVar282 * (fVar259 * fVar330 - fVar266 * fVar267) * fVar265 * fVar208;
                fVar133 = fStack_3f0 * fVar298 +
                          (float)local_3f8._4_4_ * fVar295 + (float)local_3f8._0_4_ * fVar293;
                fVar245 = fVar209 - fVar324 * fVar324;
                auVar117._0_8_ = CONCAT44(fVar233 - fVar327 * fVar327,fVar245);
                auVar117._8_4_ = fVar161 - fVar312 * fVar312;
                auVar117._12_4_ = fVar197 - fVar321 * fVar321;
                fVar259 = -fVar258 * fVar235;
                local_448 = (fStack_3f0 * fVar234 +
                            (float)local_3f8._4_4_ * fVar210 + (float)local_3f8._0_4_ * fVar208) -
                            fVar324 * fVar133;
                fStack_444 = fStack_3ec * fVar235;
                fStack_440 = fStack_3f0 * fVar234;
                fStack_43c = fStack_3ec * fVar235;
                auVar187._8_4_ = auVar117._8_4_;
                auVar187._0_8_ = auVar117._0_8_;
                auVar187._12_4_ = auVar117._12_4_;
                auVar88 = rsqrtss(auVar187,auVar117);
                fVar235 = auVar88._0_4_;
                register0x000012c4 = auVar88._4_12_;
                local_458._0_4_ = fVar235 * fVar235 * fVar245 * -0.5 * fVar235 + fVar235 * 1.5;
                if (fVar245 < 0.0) {
                  local_488._4_4_ = fVar308;
                  local_488._0_4_ = fVar133;
                  fStack_480 = fStack_3f0 * fVar298;
                  fStack_47c = fVar308;
                  fVar245 = sqrtf(fVar245);
                  lVar65 = extraout_RAX_02;
                  fVar133 = (float)local_488._0_4_;
                  fVar308 = (float)local_488._4_4_;
                }
                else {
                  fVar245 = SQRT(fVar245);
                }
                auVar290 = _DAT_01fec6c0;
                auVar203._4_4_ = fVar233;
                auVar203._0_4_ = fVar209;
                auVar203._8_4_ = fVar161;
                auVar203._12_4_ = fVar197;
                fVar245 = fVar245 - fVar242;
                fVar161 = ((-fVar277 * fVar234 + -fVar274 * fVar210 + -fVar267 * fVar208) -
                          fVar324 * fVar330) * (float)local_458._0_4_ - fVar258;
                auVar34._4_4_ = fStack_444;
                auVar34._0_4_ = local_448;
                auVar34._8_4_ = fStack_440;
                auVar34._12_4_ = fStack_43c;
                auVar188._4_12_ = auVar34._4_12_;
                auVar188._0_4_ = local_448 * (float)local_458._0_4_;
                auVar336._0_8_ = CONCAT44(fVar259,fVar161) ^ 0x8000000080000000;
                auVar336._8_4_ = -fVar259;
                auVar336._12_4_ = fVar306 * -fVar258;
                auVar335._8_8_ = auVar336._8_8_;
                auVar335._0_8_ = CONCAT44(fVar330,fVar161) ^ 0x80000000;
                auVar349._0_4_ = fVar330 * auVar188._0_4_ - fVar133 * fVar161;
                auVar190._0_8_ = auVar188._0_8_;
                auVar190._8_4_ = fStack_444;
                auVar190._12_4_ = -fVar308;
                auVar189._8_8_ = auVar190._8_8_;
                auVar189._0_8_ = CONCAT44(fVar133,auVar188._0_4_) ^ 0x8000000000000000;
                auVar349._4_4_ = auVar349._0_4_;
                auVar349._8_4_ = auVar349._0_4_;
                auVar349._12_4_ = auVar349._0_4_;
                auVar88 = divps(auVar189,auVar349);
                auVar272 = divps(auVar335,auVar349);
                fVar128 = fVar128 - (auVar88._4_4_ * fVar245 + auVar88._0_4_ * fVar324);
                fVar130 = fVar130 - (auVar272._4_4_ * fVar245 + auVar272._0_4_ * fVar324);
                lVar65 = CONCAT71((int7)((ulong)lVar65 >> 8),1);
                auVar88 = _DAT_01fec6c0;
                if (((float)((uint)fVar324 & (uint)DAT_01fec6c0) < fVar310) &&
                   ((float)((uint)fVar245 & (uint)DAT_01fec6c0) <
                    local_498 * 1.9073486e-06 + fVar243 + fVar310)) {
                  fVar130 = fVar130 + (float)local_3a8._0_4_;
                  if ((fVar86 <= fVar130) &&
                     (((fVar133 = *(float *)(ray + k * 4 + 0x80), fVar130 <= fVar133 &&
                       (0.0 <= fVar128)) && (fVar128 <= 1.0)))) {
                    auVar272 = rsqrtss(auVar203,auVar203);
                    fVar161 = auVar272._0_4_;
                    pGVar19 = (context->scene->geometries).items[local_430].ptr;
                    pRVar70 = (RTCIntersectArguments *)context;
                    if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar19->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        uVar74 = 1;
                      }
                      else {
                        fVar161 = fVar161 * 1.5 + fVar161 * fVar161 * local_478 * -0.5 * fVar161;
                        fVar208 = fVar208 * fVar161;
                        fVar210 = fVar210 * fVar161;
                        fVar234 = fVar234 * fVar161;
                        fVar161 = fVar258 * fVar208 + fVar267;
                        fVar197 = fVar258 * fVar210 + fVar274;
                        fVar209 = fVar258 * fVar234 + fVar277;
                        fVar233 = fVar210 * fVar267 - fVar274 * fVar208;
                        fVar210 = fVar234 * fVar274 - fVar277 * fVar210;
                        fVar208 = fVar208 * fVar277 - fVar267 * fVar234;
                        local_248 = fVar210 * fVar197 - fVar208 * fVar161;
                        local_268._4_4_ = fVar208 * fVar209 - fVar233 * fVar197;
                        local_258 = fVar233 * fVar161 - fVar210 * fVar209;
                        local_268._0_4_ = local_268._4_4_;
                        fStack_260 = (float)local_268._4_4_;
                        fStack_25c = (float)local_268._4_4_;
                        fStack_254 = local_258;
                        fStack_250 = local_258;
                        fStack_24c = local_258;
                        fStack_244 = local_248;
                        fStack_240 = local_248;
                        fStack_23c = local_248;
                        local_238 = fVar128;
                        fStack_234 = fVar128;
                        fStack_230 = fVar128;
                        fStack_22c = fVar128;
                        local_228 = 0;
                        uStack_220 = 0;
                        local_218 = CONCAT44(uStack_364,local_368);
                        uStack_210 = CONCAT44(uStack_35c,uStack_360);
                        local_208 = CONCAT44(uStack_354,local_358);
                        uStack_200 = CONCAT44(uStack_34c,uStack_350);
                        local_1f8 = context->user->instID[0];
                        uStack_1f4 = local_1f8;
                        uStack_1f0 = local_1f8;
                        uStack_1ec = local_1f8;
                        local_1e8 = context->user->instPrimID[0];
                        uStack_1e4 = local_1e8;
                        uStack_1e0 = local_1e8;
                        uStack_1dc = local_1e8;
                        *(float *)(ray + k * 4 + 0x80) = fVar130;
                        local_578 = *local_438;
                        uStack_570 = local_438[1];
                        _local_518 = (int *)&local_578;
                        uStack_510 = pGVar19->userPtr;
                        local_508 = context->user;
                        local_500 = ray;
                        local_4f8 = (RTCHitN *)local_268;
                        local_4f0 = 4;
                        p_Var67 = pGVar19->occlusionFilterN;
                        auVar88 = auVar290;
                        if (p_Var67 != (RTCFilterFunctionN)0x0) {
                          pRVar77 = (RTCFilterFunctionNArguments *)local_518;
                          p_Var67 = (RTCFilterFunctionN)(*p_Var67)(pRVar77);
                          auVar88 = _DAT_01fec6c0;
                        }
                        auVar118._0_4_ = -(uint)((int)local_578 == 0);
                        auVar118._4_4_ = -(uint)(local_578._4_4_ == 0);
                        auVar118._8_4_ = -(uint)((int)uStack_570 == 0);
                        auVar118._12_4_ = -(uint)(uStack_570._4_4_ == 0);
                        uVar81 = movmskps((int)p_Var67,auVar118);
                        pRVar66 = (RayK<4> *)(ulong)(uVar81 ^ 0xf);
                        if ((uVar81 ^ 0xf) == 0) {
                          auVar118 = auVar118 ^ _DAT_01febe20;
                        }
                        else {
                          pRVar70 = context->args;
                          if (((RTCIntersectArguments *)pRVar70->filter !=
                               (RTCIntersectArguments *)0x0) &&
                             ((((ulong)*(Scene **)&pRVar70->flags & 2) != 0 ||
                              (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                            pRVar77 = (RTCFilterFunctionNArguments *)local_518;
                            (*(code *)pRVar70->filter)();
                            auVar88 = _DAT_01fec6c0;
                          }
                          auVar151._0_4_ = -(uint)((int)local_578 == 0);
                          auVar151._4_4_ = -(uint)(local_578._4_4_ == 0);
                          auVar151._8_4_ = -(uint)((int)uStack_570 == 0);
                          auVar151._12_4_ = -(uint)(uStack_570._4_4_ == 0);
                          auVar118 = auVar151 ^ _DAT_01febe20;
                          *(undefined1 (*) [16])(local_500 + 0x80) =
                               ~auVar151 & _DAT_01feba00 |
                               *(undefined1 (*) [16])(local_500 + 0x80) & auVar151;
                          pRVar66 = local_500;
                        }
                        auVar119._0_4_ = auVar118._0_4_ << 0x1f;
                        auVar119._4_4_ = auVar118._4_4_ << 0x1f;
                        auVar119._8_4_ = auVar118._8_4_ << 0x1f;
                        auVar119._12_4_ = auVar118._12_4_ << 0x1f;
                        iVar62 = movmskps((int)pRVar66,auVar119);
                        uVar74 = (ulong)(iVar62 != 0);
                        if (iVar62 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar133;
                        }
                      }
                      lVar65 = 0;
                      goto LAB_00be34f7;
                    }
                  }
                  lVar65 = 0;
                  uVar74 = 0;
                }
LAB_00be34f7:
                bVar73 = (byte)uVar74;
                if ((char)lVar65 == '\0') goto LAB_00be3801;
                lVar79 = lVar79 + -1;
              } while (lVar79 != 0);
              bVar73 = 0;
LAB_00be3801:
              uVar74 = (ulong)(bVar73 & 1);
              fVar128 = *(float *)(ray + k * 4 + 0x80);
              local_3d8._0_4_ = -(uint)(local_4a8 <= fVar128) & local_3d8._0_4_;
              local_3d8._4_4_ = -(uint)(fStack_4a4 <= fVar128) & local_3d8._4_4_;
              local_3d8._8_4_ = -(uint)(fStack_4a0 <= fVar128) & local_3d8._8_4_;
              local_3d8._12_4_ = -(uint)(fStack_49c <= fVar128) & local_3d8._12_4_;
              bVar78 = bVar78 | bVar73 & 1;
              uVar69 = (undefined4)((ulong)lVar65 >> 0x20);
              iVar62 = movmskps((int)lVar65,local_3d8);
            } while (iVar62 != 0);
          }
          auVar164 = _local_1d8;
          fVar128 = *(float *)(ray + k * 4 + 0x80);
          local_4d8._0_4_ = -(uint)((float)local_4d8._0_4_ + local_548 <= fVar128) & local_428._0_4_
          ;
          local_4d8._4_4_ =
               -(uint)((float)local_4d8._4_4_ + fStack_544 <= fVar128) & local_428._4_4_;
          fStack_4d0 = (float)(-(uint)(fStack_4d0 + fStack_540 <= fVar128) & (uint)fStack_420);
          fStack_4cc = (float)(-(uint)(fStack_4cc + fStack_53c <= fVar128) & (uint)fStack_41c);
          local_4c8._0_4_ =
               -(uint)((int)local_3c8 <
                      ((int)((local_4c8._0_4_ & local_4e8._0_4_) << 0x1f) >> 0x1f) + 4);
          local_4c8._4_4_ =
               -(uint)((int)fStack_3c4 <
                      ((int)((local_4c8._4_4_ & local_4e8._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_4c0 = (float)-(uint)((int)fStack_3c0 <
                                     ((int)(((uint)fStack_4c0 & (uint)fStack_4e0) << 0x1f) >> 0x1f)
                                     + 4);
          fStack_4bc = (float)-(uint)((int)fStack_3bc <
                                     ((int)(((uint)fStack_4bc & (uint)fStack_4dc) << 0x1f) >> 0x1f)
                                     + 4);
          local_3e8 = ~_local_4c8 & _local_4d8;
          iVar62 = movmskps(iVar62,local_3e8);
          if (iVar62 != 0) {
            local_4a8 = local_548 + (float)local_1d8._0_4_;
            fStack_4a4 = fStack_544 + (float)local_1d8._4_4_;
            fStack_4a0 = fStack_540 + fStack_1d0;
            fStack_49c = fStack_53c + fStack_1cc;
            do {
              auVar166 = ~local_3e8 & _DAT_01feb9f0 | local_3e8 & auVar164;
              auVar191._4_4_ = auVar166._0_4_;
              auVar191._0_4_ = auVar166._4_4_;
              auVar191._8_4_ = auVar166._12_4_;
              auVar191._12_4_ = auVar166._8_4_;
              auVar272 = minps(auVar191,auVar166);
              auVar152._0_8_ = auVar272._8_8_;
              auVar152._8_4_ = auVar272._0_4_;
              auVar152._12_4_ = auVar272._4_4_;
              auVar272 = minps(auVar152,auVar272);
              auVar153._0_8_ =
                   CONCAT44(-(uint)(auVar272._4_4_ == auVar166._4_4_) & local_3e8._4_4_,
                            -(uint)(auVar272._0_4_ == auVar166._0_4_) & local_3e8._0_4_);
              auVar153._8_4_ = -(uint)(auVar272._8_4_ == auVar166._8_4_) & local_3e8._8_4_;
              auVar153._12_4_ = -(uint)(auVar272._12_4_ == auVar166._12_4_) & local_3e8._12_4_;
              iVar62 = movmskps(iVar62,auVar153);
              auVar120 = local_3e8;
              if (iVar62 != 0) {
                auVar120._8_4_ = auVar153._8_4_;
                auVar120._0_8_ = auVar153._0_8_;
                auVar120._12_4_ = auVar153._12_4_;
              }
              uVar63 = movmskps(iVar62,auVar120);
              lVar65 = 0;
              if (CONCAT44(uVar69,uVar63) != 0) {
                for (; (CONCAT44(uVar69,uVar63) >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
                }
              }
              *(undefined4 *)(local_3e8 + lVar65 * 4) = 0;
              fVar128 = local_398[lVar65];
              fVar130 = *(float *)(local_1c8 + lVar65 * 4);
              fVar133 = SQRT(fVar196);
              if ((float)local_408._0_4_ < 0.0) {
                fVar133 = sqrtf((float)local_408._0_4_);
                lVar65 = extraout_RAX_03;
                auVar88 = _DAT_01fec6c0;
              }
              auVar28._4_4_ = fVar174;
              auVar28._0_4_ = fVar162;
              auVar28._8_4_ = fVar176;
              auVar28._12_4_ = fVar195;
              auVar32._4_4_ = fStack_524;
              auVar32._0_4_ = local_528;
              auVar32._8_4_ = fStack_520;
              auVar32._12_4_ = fStack_51c;
              auVar166 = minps(auVar28,auVar32);
              auVar183 = maxps(auVar28,auVar32);
              auVar30._4_4_ = fStack_534;
              auVar30._0_4_ = local_538;
              auVar30._8_4_ = fStack_530;
              auVar30._12_4_ = fStack_52c;
              auVar272 = minps(auVar30,_local_608);
              auVar166 = minps(auVar166,auVar272);
              auVar272 = maxps(auVar30,_local_608);
              auVar272 = maxps(auVar183,auVar272);
              auVar204._0_4_ = auVar166._0_4_ & auVar88._0_4_;
              auVar204._4_4_ = auVar166._4_4_ & auVar88._4_4_;
              auVar204._8_4_ = auVar166._8_4_ & auVar88._8_4_;
              auVar204._12_4_ = auVar166._12_4_ & auVar88._12_4_;
              local_498 = auVar272._12_4_;
              auVar121._0_4_ = auVar272._0_4_ & auVar88._0_4_;
              auVar121._4_4_ = auVar272._4_4_ & auVar88._4_4_;
              auVar121._8_4_ = auVar272._8_4_ & auVar88._8_4_;
              auVar121._12_4_ = (uint)local_498 & auVar88._12_4_;
              auVar88 = maxps(auVar204,auVar121);
              fVar160 = auVar88._4_4_;
              if (auVar88._4_4_ <= auVar88._0_4_) {
                fVar160 = auVar88._0_4_;
              }
              auVar205._8_8_ = auVar88._8_8_;
              auVar205._0_8_ = auVar88._8_8_;
              if (auVar88._8_4_ <= fVar160) {
                auVar205._0_4_ = fVar160;
              }
              fVar160 = auVar205._0_4_ * 1.9073486e-06;
              local_468 = fVar133 * 1.9073486e-06;
              fStack_494 = local_498;
              fStack_490 = local_498;
              fStack_48c = local_498;
              lVar79 = 5;
              do {
                auVar289._4_12_ = auVar290._4_12_;
                fVar245 = 1.0 - fVar128;
                fVar243 = fVar128 * fVar245;
                fVar208 = fVar245 * fVar245 * fVar245;
                fVar133 = fVar128 * fVar128 * fVar128;
                fVar197 = (fVar243 * fVar128 * 12.0 + fVar245 * fVar243 * 6.0 +
                          fVar133 * 4.0 + fVar208) * 0.16666667;
                fVar161 = fVar133 * 0.16666667;
                fVar209 = fVar208 * 0.16666667;
                fVar133 = (fVar245 * fVar243 * 12.0 + fVar243 * fVar128 * 6.0 +
                          fVar208 * 4.0 + fVar133) * 0.16666667;
                fVar242 = fVar209 * fVar195 +
                          fVar133 * fStack_51c + fVar197 * fStack_52c + fVar161 * fStack_5fc;
                fVar208 = (fVar130 * (float)local_3f8._0_4_ + 0.0) -
                          (fVar209 * fVar162 +
                          fVar133 * local_528 +
                          fVar197 * local_538 + fVar161 * (float)local_608._0_4_);
                fVar210 = (fVar130 * (float)local_3f8._4_4_ + 0.0) -
                          (fVar209 * fVar174 +
                          fVar133 * fStack_524 +
                          fVar197 * fStack_534 + fVar161 * (float)local_608._4_4_);
                fVar234 = (fVar130 * fStack_3f0 + 0.0) -
                          (fVar209 * fVar176 +
                          fVar133 * fStack_520 + fVar197 * fStack_530 + fVar161 * fStack_600);
                fVar235 = (fVar130 * fStack_3ec + 0.0) - fVar242;
                fVar133 = fVar210 * fVar210;
                fVar161 = fVar234 * fVar234;
                fVar197 = fVar235 * fVar235;
                fVar209 = fVar133 + fVar208 * fVar208 + fVar161;
                fVar233 = fVar133 + fVar133 + fVar197;
                fVar161 = fVar133 + fVar161 + fVar161;
                fVar197 = fVar133 + fVar197 + fVar197;
                local_478 = fVar209;
                if (fVar209 < 0.0) {
                  fVar133 = sqrtf(fVar209);
                  auVar289._4_4_ = extraout_var._0_4_;
                  auVar289._0_4_ = fVar133;
                  auVar289._8_4_ = extraout_var._4_4_;
                  auVar289._12_4_ = extraout_var._8_4_;
                  lVar65 = extraout_RAX_04;
                }
                else {
                  auVar289._0_4_ = SQRT(fVar209);
                }
                fVar258 = -fVar245 * fVar245 * 0.5;
                fVar133 = (-fVar128 * fVar128 - fVar243 * 4.0) * 0.5;
                fVar243 = (fVar245 * fVar245 + fVar243 * 4.0) * 0.5;
                fVar277 = fVar128 * fVar128 * 0.5;
                fVar259 = fVar258 * fVar162 +
                          fVar133 * local_528 +
                          fVar243 * local_538 + fVar277 * (float)local_608._0_4_;
                fVar267 = fVar258 * fVar174 +
                          fVar133 * fStack_524 +
                          fVar243 * fStack_534 + fVar277 * (float)local_608._4_4_;
                fVar274 = fVar258 * fVar176 +
                          fVar133 * fStack_520 + fVar243 * fStack_530 + fVar277 * fStack_600;
                fVar243 = fVar258 * fVar195 +
                          fVar133 * fStack_51c + fVar243 * fStack_52c + fVar277 * fStack_5fc;
                fVar133 = fVar128 - (fVar245 + fVar245);
                fVar258 = fVar245 - (fVar128 + fVar128);
                fVar277 = fVar245 * fVar162 +
                          fVar133 * local_528 +
                          fVar258 * local_538 + fVar128 * (float)local_608._0_4_;
                fVar330 = fVar245 * fVar174 +
                          fVar133 * fStack_524 +
                          fVar258 * fStack_534 + fVar128 * (float)local_608._4_4_;
                fVar245 = fVar245 * fVar176 +
                          fVar133 * fStack_520 + fVar258 * fStack_530 + fVar128 * fStack_600;
                fVar133 = fVar160;
                if (fVar160 <= local_468 * fVar130) {
                  fVar133 = local_468 * fVar130;
                }
                fVar258 = fVar267 * fVar267 + fVar259 * fVar259 + fVar274 * fVar274;
                auVar272 = ZEXT416((uint)fVar258);
                auVar88 = rsqrtss(ZEXT416((uint)fVar258),auVar272);
                fVar260 = auVar88._0_4_;
                fVar260 = fVar260 * fVar260 * fVar258 * -0.5 * fVar260 + fVar260 * 1.5;
                fVar265 = fVar245 * fVar274 + fVar330 * fVar267 + fVar277 * fVar259;
                auVar88 = rcpss(auVar272,auVar272);
                fVar266 = (2.0 - fVar258 * auVar88._0_4_) * auVar88._0_4_;
                fVar282 = fVar259 * fVar260;
                fVar293 = fVar267 * fVar260;
                fVar295 = fVar274 * fVar260;
                fVar298 = fVar243 * fVar260;
                if (fVar258 < 0.0) {
                  fVar306 = sqrtf(fVar258);
                  auVar289 = ZEXT416(auVar289._0_4_);
                  lVar65 = extraout_RAX_05;
                }
                else {
                  fVar306 = SQRT(fVar258);
                }
                fVar308 = fVar210 * fVar293;
                fVar310 = fVar234 * fVar295;
                fVar312 = fVar235 * fVar298;
                fVar321 = fVar308 + fVar208 * fVar282 + fVar310;
                fVar324 = fVar308 + fVar308 + fVar312;
                fVar310 = fVar308 + fVar310 + fVar310;
                fVar312 = fVar308 + fVar312 + fVar312;
                auVar290._0_4_ =
                     (auVar289._0_4_ + 1.0) * (fVar160 / fVar306) +
                     auVar289._0_4_ * fVar160 + fVar133;
                auVar290._4_12_ = auVar289._4_12_;
                fVar277 = fVar295 * -fVar274 + fVar293 * -fVar267 + fVar282 * -fVar259 +
                          fVar266 * (fVar258 * fVar245 - fVar265 * fVar274) * fVar260 * fVar234 +
                          fVar266 * (fVar258 * fVar330 - fVar265 * fVar267) * fVar260 * fVar210 +
                          fVar266 * (fVar258 * fVar277 - fVar265 * fVar259) * fVar260 * fVar208;
                local_448 = fStack_3f0 * fVar295 +
                            (float)local_3f8._4_4_ * fVar293 + (float)local_3f8._0_4_ * fVar282;
                fVar245 = fVar209 - fVar321 * fVar321;
                auVar122._0_8_ = CONCAT44(fVar233 - fVar324 * fVar324,fVar245);
                auVar122._8_4_ = fVar161 - fVar310 * fVar310;
                auVar122._12_4_ = fVar197 - fVar312 * fVar312;
                fVar258 = -fVar243 * fVar235;
                fStack_444 = fStack_3ec * fVar298;
                fStack_440 = fStack_3f0 * fVar295;
                fStack_43c = fStack_3ec * fVar298;
                local_458._4_4_ = fStack_3ec * fVar235;
                local_458._0_4_ =
                     (fStack_3f0 * fVar234 +
                     (float)local_3f8._4_4_ * fVar210 + (float)local_3f8._0_4_ * fVar208) -
                     fVar321 * local_448;
                fStack_450 = fStack_3f0 * fVar234;
                fStack_44c = fStack_3ec * fVar235;
                auVar192._8_4_ = auVar122._8_4_;
                auVar192._0_8_ = auVar122._0_8_;
                auVar192._12_4_ = auVar122._12_4_;
                auVar88 = rsqrtss(auVar192,auVar122);
                fVar235 = auVar88._0_4_;
                auVar193._4_12_ = auVar88._4_12_;
                auVar193._0_4_ = fVar235 * fVar235 * fVar245 * -0.5 * fVar235 + fVar235 * 1.5;
                if (fVar245 < 0.0) {
                  _local_488 = auVar193;
                  fVar245 = sqrtf(fVar245);
                  auVar290 = ZEXT416((uint)auVar290._0_4_);
                  lVar65 = extraout_RAX_06;
                  auVar193 = _local_488;
                }
                else {
                  fVar245 = SQRT(fVar245);
                }
                auVar88 = _DAT_01fec6c0;
                auVar206._4_4_ = fVar233;
                auVar206._0_4_ = fVar209;
                auVar206._8_4_ = fVar161;
                auVar206._12_4_ = fVar197;
                fVar245 = fVar245 - fVar242;
                fVar161 = ((-fVar274 * fVar234 + -fVar267 * fVar210 + -fVar259 * fVar208) -
                          fVar321 * fVar277) * auVar193._0_4_ - fVar243;
                auVar169._4_12_ = local_458._4_12_;
                auVar169._0_4_ = local_458._0_4_ * auVar193._0_4_;
                auVar338._0_8_ = CONCAT44(fVar258,fVar161) ^ 0x8000000080000000;
                auVar338._8_4_ = -fVar258;
                auVar338._12_4_ = fVar298 * -fVar243;
                auVar337._8_8_ = auVar338._8_8_;
                auVar337._0_8_ = CONCAT44(fVar277,fVar161) ^ 0x80000000;
                auVar350._0_4_ = fVar277 * auVar169._0_4_ - local_448 * fVar161;
                auVar171._0_8_ = auVar169._0_8_;
                auVar171._8_4_ = local_458._4_4_;
                auVar171._12_4_ = -fStack_444;
                auVar170._8_8_ = auVar171._8_8_;
                auVar170._0_8_ = CONCAT44(local_448,auVar169._0_4_) ^ 0x8000000000000000;
                auVar350._4_4_ = auVar350._0_4_;
                auVar350._8_4_ = auVar350._0_4_;
                auVar350._12_4_ = auVar350._0_4_;
                auVar272 = divps(auVar170,auVar350);
                auVar166 = divps(auVar337,auVar350);
                fVar128 = fVar128 - (auVar272._4_4_ * fVar245 + auVar272._0_4_ * fVar321);
                fVar130 = fVar130 - (auVar166._4_4_ * fVar245 + auVar166._0_4_ * fVar321);
                lVar65 = CONCAT71((int7)((ulong)lVar65 >> 8),1);
                if (((float)((uint)fVar321 & (uint)DAT_01fec6c0) < auVar290._0_4_) &&
                   ((float)((uint)fVar245 & (uint)DAT_01fec6c0) <
                    local_498 * 1.9073486e-06 + fVar133 + auVar290._0_4_)) {
                  fVar130 = fVar130 + (float)local_3a8._0_4_;
                  if ((fVar86 <= fVar130) &&
                     (((fVar133 = *(float *)(ray + k * 4 + 0x80), fVar130 <= fVar133 &&
                       (0.0 <= fVar128)) && (fVar128 <= 1.0)))) {
                    auVar272 = rsqrtss(auVar206,auVar206);
                    fVar161 = auVar272._0_4_;
                    pGVar19 = (context->scene->geometries).items[local_430].ptr;
                    pRVar70 = (RTCIntersectArguments *)context;
                    if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar19->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        uVar74 = 1;
                      }
                      else {
                        fVar161 = fVar161 * 1.5 + fVar161 * fVar161 * local_478 * -0.5 * fVar161;
                        fVar208 = fVar208 * fVar161;
                        fVar210 = fVar210 * fVar161;
                        fVar234 = fVar234 * fVar161;
                        fVar161 = fVar243 * fVar208 + fVar259;
                        fVar197 = fVar243 * fVar210 + fVar267;
                        fVar209 = fVar243 * fVar234 + fVar274;
                        fVar233 = fVar210 * fVar259 - fVar267 * fVar208;
                        fVar210 = fVar234 * fVar267 - fVar274 * fVar210;
                        fVar208 = fVar208 * fVar274 - fVar259 * fVar234;
                        local_248 = fVar210 * fVar197 - fVar208 * fVar161;
                        local_268._4_4_ = fVar208 * fVar209 - fVar233 * fVar197;
                        local_258 = fVar233 * fVar161 - fVar210 * fVar209;
                        local_268._0_4_ = local_268._4_4_;
                        fStack_260 = (float)local_268._4_4_;
                        fStack_25c = (float)local_268._4_4_;
                        fStack_254 = local_258;
                        fStack_250 = local_258;
                        fStack_24c = local_258;
                        fStack_244 = local_248;
                        fStack_240 = local_248;
                        fStack_23c = local_248;
                        local_238 = fVar128;
                        fStack_234 = fVar128;
                        fStack_230 = fVar128;
                        fStack_22c = fVar128;
                        local_228 = 0;
                        uStack_220 = 0;
                        local_218 = CONCAT44(uStack_364,local_368);
                        uStack_210 = CONCAT44(uStack_35c,uStack_360);
                        local_208 = CONCAT44(uStack_354,local_358);
                        uStack_200 = CONCAT44(uStack_34c,uStack_350);
                        local_1f8 = context->user->instID[0];
                        uStack_1f4 = local_1f8;
                        uStack_1f0 = local_1f8;
                        uStack_1ec = local_1f8;
                        local_1e8 = context->user->instPrimID[0];
                        uStack_1e4 = local_1e8;
                        uStack_1e0 = local_1e8;
                        uStack_1dc = local_1e8;
                        *(float *)(ray + k * 4 + 0x80) = fVar130;
                        local_578 = *local_438;
                        uStack_570 = local_438[1];
                        _local_518 = (int *)&local_578;
                        uStack_510 = pGVar19->userPtr;
                        local_508 = context->user;
                        local_500 = ray;
                        local_4f8 = (RTCHitN *)local_268;
                        local_4f0 = 4;
                        p_Var67 = pGVar19->occlusionFilterN;
                        if (p_Var67 != (RTCFilterFunctionN)0x0) {
                          pRVar77 = (RTCFilterFunctionNArguments *)local_518;
                          p_Var67 = (RTCFilterFunctionN)(*p_Var67)(pRVar77);
                          auVar88 = _DAT_01fec6c0;
                        }
                        auVar123._0_4_ = -(uint)((int)local_578 == 0);
                        auVar123._4_4_ = -(uint)(local_578._4_4_ == 0);
                        auVar123._8_4_ = -(uint)((int)uStack_570 == 0);
                        auVar123._12_4_ = -(uint)(uStack_570._4_4_ == 0);
                        uVar81 = movmskps((int)p_Var67,auVar123);
                        pRVar66 = (RayK<4> *)(ulong)(uVar81 ^ 0xf);
                        if ((uVar81 ^ 0xf) == 0) {
                          auVar123 = auVar123 ^ _DAT_01febe20;
                        }
                        else {
                          pRVar70 = context->args;
                          if (((RTCIntersectArguments *)pRVar70->filter !=
                               (RTCIntersectArguments *)0x0) &&
                             ((((ulong)*(Scene **)&pRVar70->flags & 2) != 0 ||
                              (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                            pRVar77 = (RTCFilterFunctionNArguments *)local_518;
                            (*(code *)pRVar70->filter)();
                            auVar88 = _DAT_01fec6c0;
                          }
                          auVar154._0_4_ = -(uint)((int)local_578 == 0);
                          auVar154._4_4_ = -(uint)(local_578._4_4_ == 0);
                          auVar154._8_4_ = -(uint)((int)uStack_570 == 0);
                          auVar154._12_4_ = -(uint)(uStack_570._4_4_ == 0);
                          auVar123 = auVar154 ^ _DAT_01febe20;
                          *(undefined1 (*) [16])(local_500 + 0x80) =
                               ~auVar154 & _DAT_01feba00 |
                               *(undefined1 (*) [16])(local_500 + 0x80) & auVar154;
                          pRVar66 = local_500;
                        }
                        auVar124._0_4_ = auVar123._0_4_ << 0x1f;
                        auVar124._4_4_ = auVar123._4_4_ << 0x1f;
                        auVar124._8_4_ = auVar123._8_4_ << 0x1f;
                        auVar124._12_4_ = auVar123._12_4_ << 0x1f;
                        iVar62 = movmskps((int)pRVar66,auVar124);
                        uVar74 = (ulong)(iVar62 != 0);
                        if (iVar62 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar133;
                        }
                      }
                      lVar65 = 0;
                      goto LAB_00be40b2;
                    }
                  }
                  lVar65 = 0;
                  uVar74 = 0;
                }
LAB_00be40b2:
                bVar73 = (byte)uVar74;
                if ((char)lVar65 == '\0') goto LAB_00be43c7;
                lVar79 = lVar79 + -1;
              } while (lVar79 != 0);
              bVar73 = 0;
LAB_00be43c7:
              uVar74 = (ulong)(bVar73 & 1);
              fVar128 = *(float *)(ray + k * 4 + 0x80);
              local_3e8._0_4_ = -(uint)(local_4a8 <= fVar128) & local_3e8._0_4_;
              local_3e8._4_4_ = -(uint)(fStack_4a4 <= fVar128) & local_3e8._4_4_;
              local_3e8._8_4_ = -(uint)(fStack_4a0 <= fVar128) & local_3e8._8_4_;
              local_3e8._12_4_ = -(uint)(fStack_49c <= fVar128) & local_3e8._12_4_;
              bVar78 = bVar78 | bVar73 & 1;
              uVar69 = (undefined4)((ulong)lVar65 >> 0x20);
              iVar62 = movmskps((int)lVar65,local_3e8);
            } while (iVar62 != 0);
          }
          fVar128 = *(float *)(ray + k * 4 + 0x80);
          auVar207._0_4_ =
               local_558._0_4_ & local_3b8._0_4_ &
               -(uint)(local_548 + (float)local_118._0_4_ <= fVar128);
          auVar207._4_4_ =
               local_558._4_4_ & local_3b8._4_4_ &
               -(uint)(fStack_544 + (float)local_118._4_4_ <= fVar128);
          auVar207._8_4_ =
               (uint)fStack_550 & local_3b8._8_4_ & -(uint)(fStack_540 + fStack_110 <= fVar128);
          auVar207._12_4_ =
               (uint)fStack_54c & local_3b8._12_4_ & -(uint)(fStack_53c + fStack_10c <= fVar128);
          auVar172._0_4_ =
               local_4c8._0_4_ & local_4d8._0_4_ &
               -(uint)(local_548 + (float)local_1d8._0_4_ <= fVar128);
          auVar172._4_4_ =
               local_4c8._4_4_ & local_4d8._4_4_ &
               -(uint)(fStack_544 + (float)local_1d8._4_4_ <= fVar128);
          auVar172._8_4_ =
               (uint)fStack_4c0 & (uint)fStack_4d0 & -(uint)(fStack_540 + fStack_1d0 <= fVar128);
          auVar172._12_4_ =
               (uint)fStack_4bc & (uint)fStack_4cc & -(uint)(fStack_53c + fStack_1cc <= fVar128);
          iVar62 = movmskps(iVar62,auVar172 | auVar207);
          lVar65 = CONCAT44(uVar69,iVar62);
          fVar276 = local_548;
          fVar279 = fStack_544;
          fVar281 = fStack_540;
          fVar307 = fStack_53c;
          fVar128 = local_4b8;
          fVar130 = fStack_4b4;
          uVar63 = uStack_4b0;
          uVar244 = uStack_4ac;
          if (iVar62 != 0) {
            uVar68 = (ulong)uVar80;
            lVar65 = uVar68 * 0x30;
            *(undefined1 (*) [16])(local_f8 + uVar68 * 0xc) = auVar172 | auVar207;
            afStack_e8[uVar68 * 0xc] =
                 (float)(~auVar207._0_4_ & local_1d8._0_4_ | local_118._0_4_ & auVar207._0_4_);
            afStack_e8[uVar68 * 0xc + 1] =
                 (float)(~auVar207._4_4_ & local_1d8._4_4_ | local_118._4_4_ & auVar207._4_4_);
            afStack_e8[uVar68 * 0xc + 2] =
                 (float)(~auVar207._8_4_ & (uint)fStack_1d0 | (uint)fStack_110 & auVar207._8_4_);
            afStack_e8[uVar68 * 0xc + 3] =
                 (float)(~auVar207._12_4_ & (uint)fStack_1cc | (uint)fStack_10c & auVar207._12_4_);
            local_d0[uVar68 * 0xc + -2] = local_4b8;
            local_d0[uVar68 * 0xc + -1] = fStack_4b4;
            fVar133 = (float)((int)local_560 + 1);
            pRVar70 = (RTCIntersectArguments *)(ulong)(uint)fVar133;
            local_d0[uVar68 * 0xc] = fVar133;
            uVar80 = uVar80 + 1;
          }
        }
      }
    }
    do {
      if (uVar80 == 0) {
        if (bVar78 != 0) {
          return local_6a9;
        }
        fVar175 = *(float *)(ray + k * 4 + 0x80);
        auVar159._4_4_ = -(uint)(fStack_1b4 <= fVar175);
        auVar159._0_4_ = -(uint)(local_1b8 <= fVar175);
        auVar159._8_4_ = -(uint)(fStack_1b0 <= fVar175);
        auVar159._12_4_ = -(uint)(fStack_1ac <= fVar175);
        uVar80 = movmskps((int)pRVar70,auVar159);
        uVar80 = (uint)local_370 - 1 & (uint)local_370 & uVar80;
        local_6a9 = uVar80 != 0;
        if (!local_6a9) {
          return local_6a9;
        }
        goto LAB_00be1aaf;
      }
      uVar81 = uVar80 - 1;
      pRVar70 = (RTCIntersectArguments *)(ulong)uVar81;
      fVar133 = *(float *)(ray + k * 4 + 0x80);
      auVar125._0_4_ =
           -(uint)(fVar276 + afStack_e8[(long)pRVar70 * 0xc] <= fVar133) &
           local_f8[(long)pRVar70 * 0xc];
      auVar125._4_4_ =
           -(uint)(fVar279 + afStack_e8[(long)pRVar70 * 0xc + 1] <= fVar133) &
           local_f8[(long)pRVar70 * 0xc + 1];
      auVar125._8_4_ =
           -(uint)(fVar281 + afStack_e8[(long)pRVar70 * 0xc + 2] <= fVar133) &
           local_f8[(long)pRVar70 * 0xc + 2];
      auVar125._12_4_ =
           -(uint)(fVar307 + afStack_e8[(long)pRVar70 * 0xc + 3] <= fVar133) &
           (uint)afStack_e8[(long)pRVar70 * 0xc + -1];
      _local_268 = auVar125;
      iVar62 = movmskps((int)lVar65,auVar125);
      lVar65 = CONCAT44((int)((ulong)lVar65 >> 0x20),iVar62);
      if (iVar62 != 0) {
        auVar155._0_4_ = (uint)afStack_e8[(long)pRVar70 * 0xc] & auVar125._0_4_;
        auVar155._4_4_ = (uint)afStack_e8[(long)pRVar70 * 0xc + 1] & auVar125._4_4_;
        auVar155._8_4_ = (uint)afStack_e8[(long)pRVar70 * 0xc + 2] & auVar125._8_4_;
        auVar155._12_4_ = (uint)afStack_e8[(long)pRVar70 * 0xc + 3] & auVar125._12_4_;
        auVar173._0_8_ = CONCAT44(~auVar125._4_4_,~auVar125._0_4_) & 0x7f8000007f800000;
        auVar173._8_4_ = ~auVar125._8_4_ & 0x7f800000;
        auVar173._12_4_ = ~auVar125._12_4_ & 0x7f800000;
        auVar173 = auVar173 | auVar155;
        auVar194._4_4_ = auVar173._0_4_;
        auVar194._0_4_ = auVar173._4_4_;
        auVar194._8_4_ = auVar173._12_4_;
        auVar194._12_4_ = auVar173._8_4_;
        auVar164 = minps(auVar194,auVar173);
        auVar156._0_8_ = auVar164._8_8_;
        auVar156._8_4_ = auVar164._0_4_;
        auVar156._12_4_ = auVar164._4_4_;
        auVar164 = minps(auVar156,auVar164);
        auVar157._0_8_ =
             CONCAT44(-(uint)(auVar164._4_4_ == auVar173._4_4_) & auVar125._4_4_,
                      -(uint)(auVar164._0_4_ == auVar173._0_4_) & auVar125._0_4_);
        auVar157._8_4_ = -(uint)(auVar164._8_4_ == auVar173._8_4_) & auVar125._8_4_;
        auVar157._12_4_ = -(uint)(auVar164._12_4_ == auVar173._12_4_) & auVar125._12_4_;
        iVar75 = movmskps((int)lVar76,auVar157);
        if (iVar75 != 0) {
          auVar125._8_4_ = auVar157._8_4_;
          auVar125._0_8_ = auVar157._0_8_;
          auVar125._12_4_ = auVar157._12_4_;
        }
        fVar128 = local_d0[(long)pRVar70 * 0xc + -2];
        fVar130 = local_d0[(long)pRVar70 * 0xc + -1];
        uVar63 = movmskps(iVar75,auVar125);
        uVar68 = CONCAT44((int)((ulong)lVar76 >> 0x20),uVar63);
        lVar76 = 0;
        if (uVar68 != 0) {
          for (; (uVar68 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
          }
        }
        *(undefined4 *)(local_268 + lVar76 * 4) = 0;
        iVar75 = movmskps((int)pRVar77,_local_268);
        pRVar77 = (RTCFilterFunctionNArguments *)(ulong)(uint)local_d0[(long)pRVar70 * 0xc];
        if (iVar75 == 0) {
          uVar80 = uVar81;
        }
        *(undefined1 (*) [16])(local_f8 + (long)pRVar70 * 0xc) = _local_268;
        fVar130 = fVar130 - fVar128;
        _local_518 = (int *)CONCAT44(fVar130 * 0.33333334 + fVar128,fVar130 * 0.0 + fVar128);
        uStack_510 = (void *)CONCAT44(fVar130 * 1.0 + fVar128,fVar130 * 0.6666667 + fVar128);
        fVar128 = *(float *)(local_518 + lVar76 * 4);
        fVar130 = *(float *)(local_518 + lVar76 * 4 + 4);
        uVar63 = 0;
        uVar244 = 0;
        uVar81 = uVar80;
        local_560 = pRVar77;
      }
      uVar80 = uVar81;
    } while ((char)iVar62 == '\0');
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }